

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  byte bVar49;
  byte bVar50;
  byte bVar51;
  byte bVar52;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  byte bVar53;
  long lVar54;
  ulong uVar55;
  byte bVar56;
  ulong uVar57;
  byte bVar58;
  long lVar59;
  bool bVar60;
  ulong uVar61;
  uint uVar62;
  uint uVar142;
  uint uVar143;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  uint uVar145;
  uint uVar146;
  uint uVar147;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  uint uVar144;
  uint uVar148;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  float fVar149;
  float fVar168;
  float fVar169;
  vint4 bi_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar170;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar167 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar174;
  vint4 bi_1;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar188 [16];
  undefined1 auVar192 [32];
  float fVar193;
  float fVar194;
  float fVar217;
  float fVar218;
  vint4 bi;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar219;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar233 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  float fVar241;
  float fVar242;
  vint4 ai;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar249;
  undefined1 auVar247 [32];
  undefined1 auVar246 [16];
  undefined1 auVar248 [32];
  vint4 ai_1;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  vint4 ai_2;
  undefined1 auVar253 [16];
  undefined1 auVar256 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar257 [64];
  float fVar258;
  float fVar265;
  undefined1 auVar261 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar263;
  float fVar264;
  undefined1 auVar262 [64];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [64];
  float fVar271;
  undefined1 auVar269 [32];
  undefined1 auVar270 [64];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [64];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [64];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  float fVar284;
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_cfc;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  undefined1 local_8f0 [8];
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  undefined1 auStack_830 [16];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar159 [32];
  
  uVar61 = (ulong)(byte)prim[1];
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 4 + 6)));
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 5 + 6)));
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 6 + 6)));
  lVar54 = uVar61 * 0x25;
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xf + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x11 + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x1a + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x1b + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x1c + 6)));
  uVar174 = *(undefined4 *)(prim + lVar54 + 0x12);
  auVar281._4_4_ = uVar174;
  auVar281._0_4_ = uVar174;
  auVar281._8_4_ = uVar174;
  auVar281._12_4_ = uVar174;
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar63 = vsubps_avx512vl(auVar78,*(undefined1 (*) [16])(prim + lVar54 + 6));
  fVar17 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar54 + 0x16)) *
           *(float *)(prim + lVar54 + 0x1a);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar61 * 7 + 6);
  auVar267 = vpmovsxwd_avx(auVar78);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar61 * 0xb + 6);
  auVar150 = vpmovsxwd_avx(auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar61 * 9 + 6);
  auVar176 = vpmovsxwd_avx(auVar83);
  auVar64 = vpbroadcastd_avx512vl();
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar61 * 0xd + 6);
  auVar65 = vpmovsxwd_avx512vl(auVar79);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar61 * 0x12 + 6);
  auVar2 = vpmovsxwd_avx(auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar61 * 0x16 + 6);
  auVar66 = vpmovsxwd_avx512vl(auVar3);
  auVar78 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar78 = vinsertps_avx512f(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar63 = vmulps_avx512vl(auVar281,auVar63);
  auVar67 = vmulps_avx512vl(auVar281,auVar78);
  auVar68 = vcvtdq2ps_avx512vl(auVar74);
  auVar69 = vcvtdq2ps_avx512vl(auVar69);
  auVar70 = vcvtdq2ps_avx512vl(auVar70);
  auVar71 = vcvtdq2ps_avx512vl(auVar71);
  auVar72 = vcvtdq2ps_avx512vl(auVar72);
  auVar78 = vcvtdq2ps_avx(auVar73);
  auVar82 = vcvtdq2ps_avx(auVar75);
  auVar83 = vcvtdq2ps_avx(auVar76);
  auVar79 = vcvtdq2ps_avx(auVar77);
  uVar174 = auVar67._0_4_;
  auVar266._4_4_ = uVar174;
  auVar266._0_4_ = uVar174;
  auVar266._8_4_ = uVar174;
  auVar266._12_4_ = uVar174;
  auVar3 = vshufps_avx(auVar67,auVar67,0x55);
  auVar74 = vshufps_avx(auVar67,auVar67,0xaa);
  auVar73 = vmulps_avx512vl(auVar74,auVar70);
  auVar175._0_4_ = auVar74._0_4_ * auVar78._0_4_;
  auVar175._4_4_ = auVar74._4_4_ * auVar78._4_4_;
  auVar175._8_4_ = auVar74._8_4_ * auVar78._8_4_;
  auVar175._12_4_ = auVar74._12_4_ * auVar78._12_4_;
  auVar67._0_4_ = auVar79._0_4_ * auVar74._0_4_;
  auVar67._4_4_ = auVar79._4_4_ * auVar74._4_4_;
  auVar67._8_4_ = auVar79._8_4_ * auVar74._8_4_;
  auVar67._12_4_ = auVar79._12_4_ * auVar74._12_4_;
  auVar74 = vfmadd231ps_avx512vl(auVar73,auVar3,auVar69);
  auVar73 = vfmadd231ps_avx512vl(auVar175,auVar3,auVar72);
  auVar3 = vfmadd231ps_fma(auVar67,auVar83,auVar3);
  auVar74 = vfmadd231ps_avx512vl(auVar74,auVar266,auVar68);
  auVar73 = vfmadd231ps_avx512vl(auVar73,auVar266,auVar71);
  auVar3 = vfmadd231ps_fma(auVar3,auVar82,auVar266);
  auVar75 = vbroadcastss_avx512vl(auVar63);
  auVar76 = vshufps_avx512vl(auVar63,auVar63,0x55);
  auVar77 = vshufps_avx512vl(auVar63,auVar63,0xaa);
  auVar70 = vmulps_avx512vl(auVar77,auVar70);
  auVar78 = vmulps_avx512vl(auVar77,auVar78);
  auVar79 = vmulps_avx512vl(auVar77,auVar79);
  auVar69 = vfmadd231ps_avx512vl(auVar70,auVar76,auVar69);
  auVar70 = vfmadd231ps_avx512vl(auVar78,auVar76,auVar72);
  auVar78 = vfmadd231ps_fma(auVar79,auVar76,auVar83);
  auVar63 = vfmadd231ps_avx512vl(auVar69,auVar75,auVar68);
  auVar67 = vfmadd231ps_avx512vl(auVar70,auVar75,auVar71);
  auVar275._8_4_ = 0x7fffffff;
  auVar275._0_8_ = 0x7fffffff7fffffff;
  auVar275._12_4_ = 0x7fffffff;
  auVar77 = vfmadd231ps_fma(auVar78,auVar75,auVar82);
  auVar78 = vandps_avx(auVar275,auVar74);
  auVar272._8_4_ = 0x219392ef;
  auVar272._0_8_ = 0x219392ef219392ef;
  auVar272._12_4_ = 0x219392ef;
  uVar55 = vcmpps_avx512vl(auVar78,auVar272,1);
  bVar60 = (bool)((byte)uVar55 & 1);
  auVar68._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar74._0_4_;
  bVar60 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar74._4_4_;
  bVar60 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar74._8_4_;
  bVar60 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar74._12_4_;
  auVar78 = vandps_avx(auVar275,auVar73);
  uVar55 = vcmpps_avx512vl(auVar78,auVar272,1);
  bVar60 = (bool)((byte)uVar55 & 1);
  auVar80._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar73._0_4_;
  bVar60 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar73._4_4_;
  bVar60 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar73._8_4_;
  bVar60 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar73._12_4_;
  auVar78 = vandps_avx(auVar275,auVar3);
  uVar55 = vcmpps_avx512vl(auVar78,auVar272,1);
  bVar60 = (bool)((byte)uVar55 & 1);
  auVar81._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar3._0_4_;
  bVar60 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar3._4_4_;
  bVar60 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar3._8_4_;
  bVar60 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar3._12_4_;
  auVar82 = vrcp14ps_avx512vl(auVar68);
  auVar273._8_4_ = 0x3f800000;
  auVar273._0_8_ = 0x3f8000003f800000;
  auVar273._12_4_ = 0x3f800000;
  auVar78 = vfnmadd213ps_fma(auVar68,auVar82,auVar273);
  auVar83 = vfmadd132ps_fma(auVar78,auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar80);
  auVar78 = vfnmadd213ps_fma(auVar80,auVar82,auVar273);
  auVar79 = vfmadd132ps_fma(auVar78,auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar81);
  auVar78 = vfnmadd213ps_fma(auVar81,auVar82,auVar273);
  auVar3 = vfmadd132ps_fma(auVar78,auVar82,auVar82);
  auVar243._4_4_ = fVar17;
  auVar243._0_4_ = fVar17;
  auVar243._8_4_ = fVar17;
  auVar243._12_4_ = fVar17;
  auVar78 = vcvtdq2ps_avx(auVar267);
  auVar82 = vcvtdq2ps_avx(auVar150);
  auVar82 = vsubps_avx(auVar82,auVar78);
  auVar75 = vfmadd213ps_fma(auVar82,auVar243,auVar78);
  auVar78 = vcvtdq2ps_avx(auVar176);
  auVar82 = vcvtdq2ps_avx512vl(auVar65);
  auVar82 = vsubps_avx(auVar82,auVar78);
  auVar76 = vfmadd213ps_fma(auVar82,auVar243,auVar78);
  auVar78 = vcvtdq2ps_avx(auVar2);
  auVar82 = vcvtdq2ps_avx512vl(auVar66);
  auVar82 = vsubps_avx(auVar82,auVar78);
  auVar2 = vfmadd213ps_fma(auVar82,auVar243,auVar78);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar61 * 0x14 + 6);
  auVar78 = vpmovsxwd_avx(auVar74);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar61 * 0x18 + 6);
  auVar82 = vpmovsxwd_avx(auVar69);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar78);
  auVar74 = vfmadd213ps_fma(auVar82,auVar243,auVar78);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar61 * 0x1d + 6);
  auVar78 = vpmovsxwd_avx(auVar70);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar61 * 0x21 + 6);
  auVar82 = vpmovsxwd_avx(auVar71);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar78);
  auVar69 = vfmadd213ps_fma(auVar82,auVar243,auVar78);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar61 * 0x1f + 6);
  auVar78 = vpmovsxwd_avx(auVar72);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar61 * 0x23 + 6);
  auVar82 = vpmovsxwd_avx(auVar73);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar78);
  auVar82 = vfmadd213ps_fma(auVar82,auVar243,auVar78);
  auVar78 = vsubps_avx512vl(auVar75,auVar63);
  auVar65._0_4_ = auVar83._0_4_ * auVar78._0_4_;
  auVar65._4_4_ = auVar83._4_4_ * auVar78._4_4_;
  auVar65._8_4_ = auVar83._8_4_ * auVar78._8_4_;
  auVar65._12_4_ = auVar83._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx512vl(auVar76,auVar63);
  auVar63._0_4_ = auVar83._0_4_ * auVar78._0_4_;
  auVar63._4_4_ = auVar83._4_4_ * auVar78._4_4_;
  auVar63._8_4_ = auVar83._8_4_ * auVar78._8_4_;
  auVar63._12_4_ = auVar83._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar2,auVar67);
  auVar66._0_4_ = auVar79._0_4_ * auVar78._0_4_;
  auVar66._4_4_ = auVar79._4_4_ * auVar78._4_4_;
  auVar66._8_4_ = auVar79._8_4_ * auVar78._8_4_;
  auVar66._12_4_ = auVar79._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar74,auVar67);
  auVar176._0_4_ = auVar79._0_4_ * auVar78._0_4_;
  auVar176._4_4_ = auVar79._4_4_ * auVar78._4_4_;
  auVar176._8_4_ = auVar79._8_4_ * auVar78._8_4_;
  auVar176._12_4_ = auVar79._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar69,auVar77);
  auVar253._0_4_ = auVar3._0_4_ * auVar78._0_4_;
  auVar253._4_4_ = auVar3._4_4_ * auVar78._4_4_;
  auVar253._8_4_ = auVar3._8_4_ * auVar78._8_4_;
  auVar253._12_4_ = auVar3._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar82,auVar77);
  auVar150._0_4_ = auVar3._0_4_ * auVar78._0_4_;
  auVar150._4_4_ = auVar3._4_4_ * auVar78._4_4_;
  auVar150._8_4_ = auVar3._8_4_ * auVar78._8_4_;
  auVar150._12_4_ = auVar3._12_4_ * auVar78._12_4_;
  auVar78 = vpminsd_avx(auVar65,auVar63);
  auVar82 = vpminsd_avx(auVar66,auVar176);
  auVar78 = vmaxps_avx(auVar78,auVar82);
  auVar82 = vpminsd_avx(auVar253,auVar150);
  uVar174 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar75._4_4_ = uVar174;
  auVar75._0_4_ = uVar174;
  auVar75._8_4_ = uVar174;
  auVar75._12_4_ = uVar174;
  auVar82 = vmaxps_avx512vl(auVar82,auVar75);
  auVar78 = vmaxps_avx(auVar78,auVar82);
  auVar76._8_4_ = 0x3f7ffffa;
  auVar76._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar76._12_4_ = 0x3f7ffffa;
  local_6c0 = vmulps_avx512vl(auVar78,auVar76);
  auVar78 = vpmaxsd_avx(auVar65,auVar63);
  auVar82 = vpmaxsd_avx(auVar66,auVar176);
  auVar78 = vminps_avx(auVar78,auVar82);
  auVar82 = vpmaxsd_avx(auVar253,auVar150);
  uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar77._4_4_ = uVar174;
  auVar77._0_4_ = uVar174;
  auVar77._8_4_ = uVar174;
  auVar77._12_4_ = uVar174;
  auVar82 = vminps_avx512vl(auVar82,auVar77);
  auVar78 = vminps_avx(auVar78,auVar82);
  auVar267._8_4_ = 0x3f800003;
  auVar267._0_8_ = 0x3f8000033f800003;
  auVar267._12_4_ = 0x3f800003;
  auVar78 = vmulps_avx512vl(auVar78,auVar267);
  uVar19 = vcmpps_avx512vl(local_6c0,auVar78,2);
  uVar21 = vpcmpgtd_avx512vl(auVar64,_DAT_01f4ad30);
  local_8a8 = (ulong)((byte)uVar19 & 0xf & (byte)uVar21);
  auVar167 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar167);
  auVar167 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  local_8b0 = prim;
LAB_018ddd46:
  if (local_8a8 == 0) {
LAB_018e080d:
    return local_8a8 != 0;
  }
  lVar54 = 0;
  for (uVar55 = local_8a8; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    lVar54 = lVar54 + 1;
  }
  uVar4 = *(uint *)(local_8b0 + 2);
  pGVar5 = (context->scene->geometries).items[uVar4].ptr;
  uVar55 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)*(uint *)(local_8b0 + lVar54 * 4 + 6) *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar17 = (pGVar5->time_range).lower;
  fVar17 = pGVar5->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x1c0) - fVar17) / ((pGVar5->time_range).upper - fVar17));
  auVar78 = vroundss_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17),9);
  auVar78 = vminss_avx(auVar78,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar78 = vmaxss_avx(ZEXT816(0) << 0x20,auVar78);
  fVar17 = fVar17 - auVar78._0_4_;
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar59 = (long)(int)auVar78._0_4_ * 0x38;
  lVar54 = *(long *)(_Var6 + 0x10 + lVar59);
  lVar7 = *(long *)(_Var6 + 0x38 + lVar59);
  lVar8 = *(long *)(_Var6 + 0x48 + lVar59);
  pfVar1 = (float *)(lVar7 + uVar55 * lVar8);
  auVar151._0_4_ = fVar17 * *pfVar1;
  auVar151._4_4_ = fVar17 * pfVar1[1];
  auVar151._8_4_ = fVar17 * pfVar1[2];
  auVar151._12_4_ = fVar17 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar55 + 1) * lVar8);
  auVar177._0_4_ = fVar17 * *pfVar1;
  auVar177._4_4_ = fVar17 * pfVar1[1];
  auVar177._8_4_ = fVar17 * pfVar1[2];
  auVar177._12_4_ = fVar17 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar55 + 2) * lVar8);
  auVar195._0_4_ = fVar17 * *pfVar1;
  auVar195._4_4_ = fVar17 * pfVar1[1];
  auVar195._8_4_ = fVar17 * pfVar1[2];
  auVar195._12_4_ = fVar17 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + lVar8 * (uVar55 + 3));
  auVar220._0_4_ = fVar17 * *pfVar1;
  auVar220._4_4_ = fVar17 * pfVar1[1];
  auVar220._8_4_ = fVar17 * pfVar1[2];
  auVar220._12_4_ = fVar17 * pfVar1[3];
  lVar7 = *(long *)(_Var6 + lVar59);
  auVar100 = auVar167._0_32_;
  auVar262 = ZEXT3264(auVar100);
  fVar17 = 1.0 - fVar17;
  auVar237._4_4_ = fVar17;
  auVar237._0_4_ = fVar17;
  auVar237._8_4_ = fVar17;
  auVar237._12_4_ = fVar17;
  auVar83 = vfmadd231ps_fma(auVar151,auVar237,*(undefined1 (*) [16])(lVar7 + lVar54 * uVar55));
  auVar79 = vfmadd231ps_fma(auVar177,auVar237,*(undefined1 (*) [16])(lVar7 + lVar54 * (uVar55 + 1)))
  ;
  auVar2 = vfmadd231ps_fma(auVar195,auVar237,*(undefined1 (*) [16])(lVar7 + lVar54 * (uVar55 + 2)));
  auVar3 = vfmadd231ps_fma(auVar220,auVar237,*(undefined1 (*) [16])(lVar7 + lVar54 * (uVar55 + 3)));
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar82 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar174 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar280._4_4_ = uVar174;
  auVar280._0_4_ = uVar174;
  auVar280._8_4_ = uVar174;
  auVar280._12_4_ = uVar174;
  local_7c0._16_4_ = uVar174;
  local_7c0._0_16_ = auVar280;
  local_7c0._20_4_ = uVar174;
  local_7c0._24_4_ = uVar174;
  local_7c0._28_4_ = uVar174;
  uVar174 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar282._4_4_ = uVar174;
  auVar282._0_4_ = uVar174;
  auVar282._8_4_ = uVar174;
  auVar282._12_4_ = uVar174;
  local_7e0._16_4_ = uVar174;
  local_7e0._0_16_ = auVar282;
  local_7e0._20_4_ = uVar174;
  local_7e0._24_4_ = uVar174;
  local_7e0._28_4_ = uVar174;
  auVar78 = vunpcklps_avx(auVar280,auVar282);
  local_800 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar70 = local_800._0_16_;
  local_9d0 = vinsertps_avx512f(auVar78,auVar70,0x28);
  auVar270 = ZEXT1664(local_9d0);
  auVar244._0_4_ = auVar83._0_4_ + auVar79._0_4_ + auVar2._0_4_ + auVar3._0_4_;
  auVar244._4_4_ = auVar83._4_4_ + auVar79._4_4_ + auVar2._4_4_ + auVar3._4_4_;
  auVar244._8_4_ = auVar83._8_4_ + auVar79._8_4_ + auVar2._8_4_ + auVar3._8_4_;
  auVar244._12_4_ = auVar83._12_4_ + auVar79._12_4_ + auVar2._12_4_ + auVar3._12_4_;
  auVar64._8_4_ = 0x3e800000;
  auVar64._0_8_ = 0x3e8000003e800000;
  auVar64._12_4_ = 0x3e800000;
  auVar78 = vmulps_avx512vl(auVar244,auVar64);
  auVar78 = vsubps_avx(auVar78,auVar82);
  auVar78 = vdpps_avx(auVar78,local_9d0,0x7f);
  auVar167 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar167);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar274 = ZEXT1664(local_9e0);
  fVar17 = *(float *)(ray + k * 4 + 0xc0);
  auVar279 = ZEXT464((uint)fVar17);
  auVar250._4_12_ = ZEXT812(0) << 0x20;
  auVar250._0_4_ = local_9e0._0_4_;
  auVar69 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar250);
  auVar74 = vfnmadd213ss_fma(auVar69,local_9e0,ZEXT416(0x40000000));
  local_620 = auVar78._0_4_ * auVar69._0_4_ * auVar74._0_4_;
  auVar167 = ZEXT464((uint)local_620);
  auVar251._4_4_ = local_620;
  auVar251._0_4_ = local_620;
  auVar251._8_4_ = local_620;
  auVar251._12_4_ = local_620;
  fStack_790 = local_620;
  _local_7a0 = auVar251;
  fStack_78c = local_620;
  fStack_788 = local_620;
  fStack_784 = local_620;
  auVar78 = vfmadd231ps_fma(auVar82,local_9d0,auVar251);
  auVar78 = vblendps_avx(auVar78,ZEXT816(0) << 0x40,8);
  auVar82 = vsubps_avx(auVar83,auVar78);
  auVar83 = vsubps_avx(auVar2,auVar78);
  auVar257 = ZEXT1664(auVar83);
  auVar79 = vsubps_avx(auVar79,auVar78);
  auVar268 = ZEXT1664(auVar79);
  auVar78 = vsubps_avx(auVar3,auVar78);
  auVar84 = vbroadcastss_avx512vl(auVar82);
  auVar99._8_4_ = 1;
  auVar99._0_8_ = 0x100000001;
  auVar99._12_4_ = 1;
  auVar99._16_4_ = 1;
  auVar99._20_4_ = 1;
  auVar99._24_4_ = 1;
  auVar99._28_4_ = 1;
  local_960 = ZEXT1632(auVar82);
  auVar85 = vpermps_avx512vl(auVar99,local_960);
  auVar285 = ZEXT3264(auVar85);
  auVar96._8_4_ = 2;
  auVar96._0_8_ = 0x200000002;
  auVar96._12_4_ = 2;
  auVar96._16_4_ = 2;
  auVar96._20_4_ = 2;
  auVar96._24_4_ = 2;
  auVar96._28_4_ = 2;
  auVar86 = vpermps_avx512vl(auVar96,local_960);
  auVar286 = ZEXT3264(auVar86);
  auVar97._8_4_ = 3;
  auVar97._0_8_ = 0x300000003;
  auVar97._12_4_ = 3;
  auVar97._16_4_ = 3;
  auVar97._20_4_ = 3;
  auVar97._24_4_ = 3;
  auVar97._28_4_ = 3;
  auVar87 = vpermps_avx512vl(auVar97,local_960);
  auVar88 = vbroadcastss_avx512vl(auVar79);
  local_9a0 = ZEXT1632(auVar79);
  auVar89 = vpermps_avx512vl(auVar99,local_9a0);
  auVar90 = vpermps_avx512vl(auVar96,local_9a0);
  auVar91 = vpermps_avx512vl(auVar97,local_9a0);
  auVar92 = vbroadcastss_avx512vl(auVar83);
  local_980 = ZEXT1632(auVar83);
  auVar93 = vpermps_avx512vl(auVar99,local_980);
  auVar94 = vpermps_avx512vl(auVar96,local_980);
  auVar95 = vpermps_avx512vl(auVar97,local_980);
  local_5a0 = vbroadcastss_avx512vl(auVar78);
  _local_9c0 = ZEXT1632(auVar78);
  local_5c0 = vpermps_avx2(auVar99,_local_9c0);
  local_5e0 = vpermps_avx512vl(auVar96,_local_9c0);
  local_600 = vpermps_avx2(auVar97,_local_9c0);
  auVar78 = vmulss_avx512f(auVar70,auVar70);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_7e0,local_7e0);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_7c0,local_7c0);
  local_560._0_4_ = auVar78._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  local_580 = vandps_avx(auVar100,local_560);
  local_910 = ZEXT416((uint)local_620);
  local_620 = fVar17 - local_620;
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  uVar55 = 0;
  bVar52 = 0;
  local_cfc = 1;
  auVar139 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar139);
  auVar78 = vsqrtss_avx(local_9e0,local_9e0);
  auVar82 = vsqrtss_avx(local_9e0,local_9e0);
  local_6b0 = ZEXT816(0x3f80000000000000);
  do {
    auVar83 = vmovshdup_avx(local_6b0);
    auVar83 = vsubps_avx(auVar83,local_6b0);
    auVar152._0_4_ = auVar83._0_4_;
    fVar18 = auVar152._0_4_ * 0.04761905;
    uVar174 = local_6b0._0_4_;
    auVar240._4_4_ = uVar174;
    auVar240._0_4_ = uVar174;
    auVar240._8_4_ = uVar174;
    auVar240._12_4_ = uVar174;
    auVar240._16_4_ = uVar174;
    auVar240._20_4_ = uVar174;
    auVar240._24_4_ = uVar174;
    auVar240._28_4_ = uVar174;
    auVar152._4_4_ = auVar152._0_4_;
    auVar152._8_4_ = auVar152._0_4_;
    auVar152._12_4_ = auVar152._0_4_;
    auVar159._16_4_ = auVar152._0_4_;
    auVar159._0_16_ = auVar152;
    auVar159._20_4_ = auVar152._0_4_;
    auVar159._24_4_ = auVar152._0_4_;
    auVar159._28_4_ = auVar152._0_4_;
    auVar83 = vfmadd231ps_fma(auVar240,auVar159,_DAT_01f7b040);
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar97 = vsubps_avx512vl(auVar96,ZEXT1632(auVar83));
    fVar258 = auVar97._0_4_;
    fVar264 = auVar97._4_4_;
    fVar234 = auVar97._8_4_;
    fVar236 = auVar97._12_4_;
    fVar241 = auVar97._16_4_;
    fVar284 = auVar97._20_4_;
    fVar194 = auVar97._24_4_;
    fVar149 = fVar258 * fVar258 * fVar258;
    fVar168 = fVar264 * fVar264 * fVar264;
    auVar100._4_4_ = fVar168;
    auVar100._0_4_ = fVar149;
    fVar169 = fVar234 * fVar234 * fVar234;
    auVar100._8_4_ = fVar169;
    fVar170 = fVar236 * fVar236 * fVar236;
    auVar100._12_4_ = fVar170;
    fVar171 = fVar241 * fVar241 * fVar241;
    auVar100._16_4_ = fVar171;
    fVar172 = fVar284 * fVar284 * fVar284;
    auVar100._20_4_ = fVar172;
    fVar173 = fVar194 * fVar194 * fVar194;
    auVar100._24_4_ = fVar173;
    auVar100._28_4_ = auVar152._0_4_;
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar99 = vmulps_avx512vl(auVar100,auVar98);
    fVar263 = auVar83._0_4_;
    fVar265 = auVar83._4_4_;
    fVar235 = auVar83._8_4_;
    fVar242 = auVar83._12_4_;
    fVar193 = fVar263 * fVar263 * fVar263;
    fVar217 = fVar265 * fVar265 * fVar265;
    fVar218 = fVar235 * fVar235 * fVar235;
    fVar219 = fVar242 * fVar242 * fVar242;
    auVar120._28_4_ = DAT_01f7b040._28_4_;
    auVar120._0_28_ = ZEXT1628(CONCAT412(fVar219,CONCAT48(fVar218,CONCAT44(fVar217,fVar193))));
    auVar139._0_4_ = fVar263 * fVar258;
    auVar139._4_4_ = fVar265 * fVar264;
    auVar139._8_4_ = fVar235 * fVar234;
    auVar139._12_4_ = fVar242 * fVar236;
    auVar139._16_4_ = fVar241 * 0.0;
    auVar139._20_4_ = fVar284 * 0.0;
    auVar139._28_36_ = auVar268._28_36_;
    auVar139._24_4_ = fVar194 * 0.0;
    auVar100 = vmulps_avx512vl(auVar120,auVar98);
    fVar271 = auVar100._28_4_ + auVar152._0_4_;
    fVar249 = fVar271 + auVar274._28_4_ + auVar167._28_4_;
    auVar107._4_4_ = fVar168 * 0.16666667;
    auVar107._0_4_ = fVar149 * 0.16666667;
    auVar107._8_4_ = fVar169 * 0.16666667;
    auVar107._12_4_ = fVar170 * 0.16666667;
    auVar107._16_4_ = fVar171 * 0.16666667;
    auVar107._20_4_ = fVar172 * 0.16666667;
    auVar107._24_4_ = fVar173 * 0.16666667;
    auVar107._28_4_ = fVar271;
    auVar103._4_4_ =
         (auVar139._4_4_ * fVar264 * 12.0 + auVar139._4_4_ * fVar265 * 6.0 + fVar217 + auVar99._4_4_
         ) * 0.16666667;
    auVar103._0_4_ =
         (auVar139._0_4_ * fVar258 * 12.0 + auVar139._0_4_ * fVar263 * 6.0 + fVar193 + auVar99._0_4_
         ) * 0.16666667;
    auVar103._8_4_ =
         (auVar139._8_4_ * fVar234 * 12.0 + auVar139._8_4_ * fVar235 * 6.0 + fVar218 + auVar99._8_4_
         ) * 0.16666667;
    auVar103._12_4_ =
         (auVar139._12_4_ * fVar236 * 12.0 + auVar139._12_4_ * fVar242 * 6.0 +
         fVar219 + auVar99._12_4_) * 0.16666667;
    auVar103._16_4_ =
         (auVar139._16_4_ * fVar241 * 12.0 + auVar139._16_4_ * 0.0 * 6.0 + auVar99._16_4_ + 0.0) *
         0.16666667;
    auVar103._20_4_ =
         (auVar139._20_4_ * fVar284 * 12.0 + auVar139._20_4_ * 0.0 * 6.0 + auVar99._20_4_ + 0.0) *
         0.16666667;
    auVar103._24_4_ =
         (auVar139._24_4_ * fVar194 * 12.0 + auVar139._24_4_ * 0.0 * 6.0 + auVar99._24_4_ + 0.0) *
         0.16666667;
    auVar103._28_4_ = auVar274._28_4_;
    auVar104._4_4_ =
         (auVar100._4_4_ + fVar168 +
         auVar139._4_4_ * fVar265 * 12.0 + auVar139._4_4_ * fVar264 * 6.0) * 0.16666667;
    auVar104._0_4_ =
         (auVar100._0_4_ + fVar149 +
         auVar139._0_4_ * fVar263 * 12.0 + auVar139._0_4_ * fVar258 * 6.0) * 0.16666667;
    auVar104._8_4_ =
         (auVar100._8_4_ + fVar169 +
         auVar139._8_4_ * fVar235 * 12.0 + auVar139._8_4_ * fVar234 * 6.0) * 0.16666667;
    auVar104._12_4_ =
         (auVar100._12_4_ + fVar170 +
         auVar139._12_4_ * fVar242 * 12.0 + auVar139._12_4_ * fVar236 * 6.0) * 0.16666667;
    auVar104._16_4_ =
         (auVar100._16_4_ + fVar171 + auVar139._16_4_ * 0.0 * 12.0 + auVar139._16_4_ * fVar241 * 6.0
         ) * 0.16666667;
    auVar104._20_4_ =
         (auVar100._20_4_ + fVar172 + auVar139._20_4_ * 0.0 * 12.0 + auVar139._20_4_ * fVar284 * 6.0
         ) * 0.16666667;
    auVar104._24_4_ =
         (auVar100._24_4_ + fVar173 + auVar139._24_4_ * 0.0 * 12.0 + auVar139._24_4_ * fVar194 * 6.0
         ) * 0.16666667;
    auVar104._28_4_ = auVar279._28_4_;
    fVar193 = fVar193 * 0.16666667;
    fVar217 = fVar217 * 0.16666667;
    fVar218 = fVar218 * 0.16666667;
    fVar219 = fVar219 * 0.16666667;
    auVar105._28_4_ = fVar249;
    auVar105._0_28_ = ZEXT1628(CONCAT412(fVar219,CONCAT48(fVar218,CONCAT44(fVar217,fVar193))));
    auVar100 = vmulps_avx512vl(local_5a0,auVar105);
    auVar106._4_4_ = local_5c0._4_4_ * fVar217;
    auVar106._0_4_ = local_5c0._0_4_ * fVar193;
    auVar106._8_4_ = local_5c0._8_4_ * fVar218;
    auVar106._12_4_ = local_5c0._12_4_ * fVar219;
    auVar106._16_4_ = local_5c0._16_4_ * 0.0;
    auVar106._20_4_ = local_5c0._20_4_ * 0.0;
    auVar106._24_4_ = local_5c0._24_4_ * 0.0;
    auVar106._28_4_ = auVar270._28_4_ + auVar279._28_4_ + DAT_01f7b040._28_4_ + auVar99._28_4_;
    auVar99 = vmulps_avx512vl(local_5e0,auVar105);
    auVar108._4_4_ = local_600._4_4_ * fVar217;
    auVar108._0_4_ = local_600._0_4_ * fVar193;
    auVar108._8_4_ = local_600._8_4_ * fVar218;
    auVar108._12_4_ = local_600._12_4_ * fVar219;
    auVar108._16_4_ = local_600._16_4_ * 0.0;
    auVar108._20_4_ = local_600._20_4_ * 0.0;
    auVar108._24_4_ = local_600._24_4_ * 0.0;
    auVar108._28_4_ = fVar249;
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar104,auVar92);
    auVar101 = vfmadd231ps_avx512vl(auVar106,auVar104,auVar93);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,auVar94);
    auVar102 = vfmadd231ps_avx512vl(auVar108,auVar95,auVar104);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,auVar88);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,auVar89);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,auVar90);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar91,auVar103);
    auVar103 = vfmadd231ps_avx512vl(auVar100,auVar107,auVar84);
    auVar104 = vfmadd231ps_avx512vl(auVar101,auVar107,auVar285._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar99,auVar107,auVar286._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar102,auVar87,auVar107);
    auVar106 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar107 = vxorps_avx512vl(auVar97,auVar106);
    auVar101 = vxorps_avx512vl(ZEXT1632(auVar83),auVar106);
    auVar121._0_4_ = auVar101._0_4_ * fVar263;
    auVar121._4_4_ = auVar101._4_4_ * fVar265;
    auVar121._8_4_ = auVar101._8_4_ * fVar235;
    auVar121._12_4_ = auVar101._12_4_ * fVar242;
    auVar121._16_4_ = auVar101._16_4_ * 0.0;
    auVar121._20_4_ = auVar101._20_4_ * 0.0;
    auVar121._24_4_ = auVar101._24_4_ * 0.0;
    auVar121._28_4_ = 0;
    auVar102 = vmulps_avx512vl(auVar139._0_32_,auVar98);
    auVar99 = vsubps_avx(auVar121,auVar102);
    auVar109._4_4_ = auVar107._4_4_ * fVar264 * 0.5;
    auVar109._0_4_ = auVar107._0_4_ * fVar258 * 0.5;
    auVar109._8_4_ = auVar107._8_4_ * fVar234 * 0.5;
    auVar109._12_4_ = auVar107._12_4_ * fVar236 * 0.5;
    auVar109._16_4_ = auVar107._16_4_ * fVar241 * 0.5;
    auVar109._20_4_ = auVar107._20_4_ * fVar284 * 0.5;
    auVar109._24_4_ = auVar107._24_4_ * fVar194 * 0.5;
    auVar109._28_4_ = auVar97._28_4_;
    auVar110._4_4_ = auVar99._4_4_ * 0.5;
    auVar110._0_4_ = auVar99._0_4_ * 0.5;
    auVar110._8_4_ = auVar99._8_4_ * 0.5;
    auVar110._12_4_ = auVar99._12_4_ * 0.5;
    auVar110._16_4_ = auVar99._16_4_ * 0.5;
    auVar110._20_4_ = auVar99._20_4_ * 0.5;
    auVar110._24_4_ = auVar99._24_4_ * 0.5;
    auVar110._28_4_ = auVar99._28_4_;
    auVar111._4_4_ = (auVar102._4_4_ + fVar264 * fVar264) * 0.5;
    auVar111._0_4_ = (auVar102._0_4_ + fVar258 * fVar258) * 0.5;
    auVar111._8_4_ = (auVar102._8_4_ + fVar234 * fVar234) * 0.5;
    auVar111._12_4_ = (auVar102._12_4_ + fVar236 * fVar236) * 0.5;
    auVar111._16_4_ = (auVar102._16_4_ + fVar241 * fVar241) * 0.5;
    auVar111._20_4_ = (auVar102._20_4_ + fVar284 * fVar284) * 0.5;
    auVar111._24_4_ = (auVar102._24_4_ + fVar194 * fVar194) * 0.5;
    auVar111._28_4_ = auVar102._28_4_ + auVar257._28_4_;
    fVar258 = fVar263 * fVar263 * 0.5;
    fVar263 = fVar265 * fVar265 * 0.5;
    fVar264 = fVar235 * fVar235 * 0.5;
    fVar265 = fVar242 * fVar242 * 0.5;
    auVar112._28_4_ = auVar262._28_4_;
    auVar112._0_28_ = ZEXT1628(CONCAT412(fVar265,CONCAT48(fVar264,CONCAT44(fVar263,fVar258))));
    auVar99 = vmulps_avx512vl(local_5a0,auVar112);
    auVar113._4_4_ = local_5c0._4_4_ * fVar263;
    auVar113._0_4_ = local_5c0._0_4_ * fVar258;
    auVar113._8_4_ = local_5c0._8_4_ * fVar264;
    auVar113._12_4_ = local_5c0._12_4_ * fVar265;
    auVar113._16_4_ = local_5c0._16_4_ * 0.0;
    auVar113._20_4_ = local_5c0._20_4_ * 0.0;
    auVar113._24_4_ = local_5c0._24_4_ * 0.0;
    auVar113._28_4_ = auVar101._28_4_;
    auVar97 = vmulps_avx512vl(local_5e0,auVar112);
    auVar117._4_4_ = fVar263 * local_600._4_4_;
    auVar117._0_4_ = fVar258 * local_600._0_4_;
    auVar117._8_4_ = fVar264 * local_600._8_4_;
    auVar117._12_4_ = fVar265 * local_600._12_4_;
    auVar117._16_4_ = local_600._16_4_ * 0.0;
    auVar117._20_4_ = local_600._20_4_ * 0.0;
    auVar117._24_4_ = local_600._24_4_ * 0.0;
    auVar117._28_4_ = auVar262._28_4_;
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar111,auVar92);
    auVar107 = vfmadd231ps_avx512vl(auVar113,auVar111,auVar93);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar111,auVar94);
    auVar83 = vfmadd231ps_fma(auVar117,auVar95,auVar111);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar110,auVar88);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar110,auVar89);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar110,auVar90);
    auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar91,auVar110);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar109,auVar84);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar285._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar109,auVar286._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar87,auVar109);
    auVar127._4_4_ = auVar99._4_4_ * fVar18;
    auVar127._0_4_ = auVar99._0_4_ * fVar18;
    auVar127._8_4_ = auVar99._8_4_ * fVar18;
    auVar127._12_4_ = auVar99._12_4_ * fVar18;
    auVar127._16_4_ = auVar99._16_4_ * fVar18;
    auVar127._20_4_ = auVar99._20_4_ * fVar18;
    auVar127._24_4_ = auVar99._24_4_ * fVar18;
    auVar127._28_4_ = auVar95._28_4_;
    auVar279 = ZEXT3264(auVar127);
    auVar128._4_4_ = auVar107._4_4_ * fVar18;
    auVar128._0_4_ = auVar107._0_4_ * fVar18;
    auVar128._8_4_ = auVar107._8_4_ * fVar18;
    auVar128._12_4_ = auVar107._12_4_ * fVar18;
    auVar128._16_4_ = auVar107._16_4_ * fVar18;
    auVar128._20_4_ = auVar107._20_4_ * fVar18;
    auVar128._24_4_ = auVar107._24_4_ * fVar18;
    auVar128._28_4_ = 0x3e2aaaab;
    auVar129._4_4_ = auVar97._4_4_ * fVar18;
    auVar129._0_4_ = auVar97._0_4_ * fVar18;
    auVar129._8_4_ = auVar97._8_4_ * fVar18;
    auVar129._12_4_ = auVar97._12_4_ * fVar18;
    auVar129._16_4_ = auVar97._16_4_ * fVar18;
    auVar129._20_4_ = auVar97._20_4_ * fVar18;
    auVar129._24_4_ = auVar97._24_4_ * fVar18;
    auVar129._28_4_ = 0x40c00000;
    fVar258 = auVar101._0_4_ * fVar18;
    fVar263 = auVar101._4_4_ * fVar18;
    auVar118._4_4_ = fVar263;
    auVar118._0_4_ = fVar258;
    fVar264 = auVar101._8_4_ * fVar18;
    auVar118._8_4_ = fVar264;
    fVar265 = auVar101._12_4_ * fVar18;
    auVar118._12_4_ = fVar265;
    fVar234 = auVar101._16_4_ * fVar18;
    auVar118._16_4_ = fVar234;
    fVar235 = auVar101._20_4_ * fVar18;
    auVar118._20_4_ = fVar235;
    fVar236 = auVar101._24_4_ * fVar18;
    auVar118._24_4_ = fVar236;
    auVar118._28_4_ = fVar18;
    auVar83 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
    auVar108 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,ZEXT1632(auVar83));
    auVar268 = ZEXT3264(auVar108);
    auVar109 = vpermt2ps_avx512vl(auVar104,_DAT_01fb9fc0,ZEXT1632(auVar83));
    auVar270 = ZEXT3264(auVar109);
    auVar97 = ZEXT1632(auVar83);
    auVar110 = vpermt2ps_avx512vl(auVar105,_DAT_01fb9fc0,auVar97);
    auVar274 = ZEXT3264(auVar110);
    auVar122._0_4_ = fVar258 + auVar100._0_4_;
    auVar122._4_4_ = fVar263 + auVar100._4_4_;
    auVar122._8_4_ = fVar264 + auVar100._8_4_;
    auVar122._12_4_ = fVar265 + auVar100._12_4_;
    auVar122._16_4_ = fVar234 + auVar100._16_4_;
    auVar122._20_4_ = fVar235 + auVar100._20_4_;
    auVar122._24_4_ = fVar236 + auVar100._24_4_;
    auVar122._28_4_ = fVar18 + auVar100._28_4_;
    auVar99 = vmaxps_avx(auVar100,auVar122);
    auVar96 = vminps_avx(auVar100,auVar122);
    auVar102 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,auVar97);
    auVar111 = vpermt2ps_avx512vl(auVar127,_DAT_01fb9fc0,auVar97);
    auVar112 = vpermt2ps_avx512vl(auVar128,_DAT_01fb9fc0,auVar97);
    auVar124 = ZEXT1632(auVar83);
    auVar113 = vpermt2ps_avx512vl(auVar129,_DAT_01fb9fc0,auVar124);
    auVar97 = vpermt2ps_avx512vl(auVar118,_DAT_01fb9fc0,auVar124);
    auVar114 = vsubps_avx512vl(auVar102,auVar97);
    auVar97 = vsubps_avx(auVar108,auVar103);
    auVar262 = ZEXT3264(auVar97);
    auVar100 = vsubps_avx(auVar109,auVar104);
    auVar257 = ZEXT3264(auVar100);
    auVar107 = vsubps_avx(auVar110,auVar105);
    auVar101 = vmulps_avx512vl(auVar100,auVar129);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar128,auVar107);
    auVar115 = vmulps_avx512vl(auVar107,auVar127);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar129,auVar97);
    auVar116 = vmulps_avx512vl(auVar97,auVar128);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar127,auVar100);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar101,auVar101);
    auVar101 = vmulps_avx512vl(auVar107,auVar107);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar100);
    auVar116 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar97);
    auVar117 = vrcp14ps_avx512vl(auVar116);
    auVar101._8_4_ = 0x3f800000;
    auVar101._0_8_ = 0x3f8000003f800000;
    auVar101._12_4_ = 0x3f800000;
    auVar101._16_4_ = 0x3f800000;
    auVar101._20_4_ = 0x3f800000;
    auVar101._24_4_ = 0x3f800000;
    auVar101._28_4_ = 0x3f800000;
    auVar101 = vfnmadd213ps_avx512vl(auVar117,auVar116,auVar101);
    auVar101 = vfmadd132ps_avx512vl(auVar101,auVar117,auVar117);
    auVar115 = vmulps_avx512vl(auVar115,auVar101);
    auVar117 = vmulps_avx512vl(auVar100,auVar113);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar112,auVar107);
    auVar118 = vmulps_avx512vl(auVar107,auVar111);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar113,auVar97);
    auVar119 = vmulps_avx512vl(auVar97,auVar112);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar111,auVar100);
    auVar119 = vmulps_avx512vl(auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar101 = vmulps_avx512vl(auVar117,auVar101);
    auVar101 = vmaxps_avx512vl(auVar115,auVar101);
    auVar101 = vsqrtps_avx512vl(auVar101);
    auVar115 = vmaxps_avx512vl(auVar114,auVar102);
    auVar99 = vmaxps_avx512vl(auVar99,auVar115);
    auVar117 = vaddps_avx512vl(auVar101,auVar99);
    auVar99 = vminps_avx512vl(auVar114,auVar102);
    auVar99 = vminps_avx(auVar96,auVar99);
    auVar99 = vsubps_avx512vl(auVar99,auVar101);
    auVar102._8_4_ = 0x3f800002;
    auVar102._0_8_ = 0x3f8000023f800002;
    auVar102._12_4_ = 0x3f800002;
    auVar102._16_4_ = 0x3f800002;
    auVar102._20_4_ = 0x3f800002;
    auVar102._24_4_ = 0x3f800002;
    auVar102._28_4_ = 0x3f800002;
    auVar96 = vmulps_avx512vl(auVar117,auVar102);
    auVar114._8_4_ = 0x3f7ffffc;
    auVar114._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar114._12_4_ = 0x3f7ffffc;
    auVar114._16_4_ = 0x3f7ffffc;
    auVar114._20_4_ = 0x3f7ffffc;
    auVar114._24_4_ = 0x3f7ffffc;
    auVar114._28_4_ = 0x3f7ffffc;
    auVar99 = vmulps_avx512vl(auVar99,auVar114);
    auVar96 = vmulps_avx512vl(auVar96,auVar96);
    auVar101 = vrsqrt14ps_avx512vl(auVar116);
    auVar115._8_4_ = 0xbf000000;
    auVar115._0_8_ = 0xbf000000bf000000;
    auVar115._12_4_ = 0xbf000000;
    auVar115._16_4_ = 0xbf000000;
    auVar115._20_4_ = 0xbf000000;
    auVar115._24_4_ = 0xbf000000;
    auVar115._28_4_ = 0xbf000000;
    auVar102 = vmulps_avx512vl(auVar116,auVar115);
    fVar258 = auVar101._0_4_;
    fVar263 = auVar101._4_4_;
    fVar264 = auVar101._8_4_;
    fVar265 = auVar101._12_4_;
    fVar234 = auVar101._16_4_;
    fVar235 = auVar101._20_4_;
    fVar236 = auVar101._24_4_;
    auVar119._4_4_ = fVar263 * fVar263 * fVar263 * auVar102._4_4_;
    auVar119._0_4_ = fVar258 * fVar258 * fVar258 * auVar102._0_4_;
    auVar119._8_4_ = fVar264 * fVar264 * fVar264 * auVar102._8_4_;
    auVar119._12_4_ = fVar265 * fVar265 * fVar265 * auVar102._12_4_;
    auVar119._16_4_ = fVar234 * fVar234 * fVar234 * auVar102._16_4_;
    auVar119._20_4_ = fVar235 * fVar235 * fVar235 * auVar102._20_4_;
    auVar119._24_4_ = fVar236 * fVar236 * fVar236 * auVar102._24_4_;
    auVar119._28_4_ = auVar117._28_4_;
    auVar116._8_4_ = 0x3fc00000;
    auVar116._0_8_ = 0x3fc000003fc00000;
    auVar116._12_4_ = 0x3fc00000;
    auVar116._16_4_ = 0x3fc00000;
    auVar116._20_4_ = 0x3fc00000;
    auVar116._24_4_ = 0x3fc00000;
    auVar116._28_4_ = 0x3fc00000;
    auVar101 = vfmadd231ps_avx512vl(auVar119,auVar101,auVar116);
    auVar102 = vmulps_avx512vl(auVar97,auVar101);
    auVar114 = vmulps_avx512vl(auVar100,auVar101);
    auVar115 = vmulps_avx512vl(auVar107,auVar101);
    auVar116 = vsubps_avx512vl(auVar124,auVar103);
    auVar117 = vsubps_avx512vl(auVar124,auVar104);
    auVar118 = vsubps_avx512vl(auVar124,auVar105);
    auVar119 = vmulps_avx512vl(local_800,auVar118);
    auVar119 = vfmadd231ps_avx512vl(auVar119,local_7e0,auVar117);
    auVar119 = vfmadd231ps_avx512vl(auVar119,local_7c0,auVar116);
    auVar120 = vmulps_avx512vl(auVar118,auVar118);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar117,auVar117);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,auVar116);
    auVar121 = vmulps_avx512vl(local_800,auVar115);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar114,local_7e0);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar102,local_7c0);
    auVar115 = vmulps_avx512vl(auVar118,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar117,auVar114);
    auVar102 = vfmadd231ps_avx512vl(auVar114,auVar116,auVar102);
    auVar114 = vmulps_avx512vl(auVar121,auVar121);
    auVar115 = vsubps_avx512vl(local_560,auVar114);
    auVar122 = vmulps_avx512vl(auVar121,auVar102);
    auVar119 = vsubps_avx512vl(auVar119,auVar122);
    auVar119 = vaddps_avx512vl(auVar119,auVar119);
    auVar122 = vmulps_avx512vl(auVar102,auVar102);
    local_a00 = vsubps_avx512vl(auVar120,auVar122);
    auVar96 = vsubps_avx512vl(local_a00,auVar96);
    auVar120 = vmulps_avx512vl(auVar119,auVar119);
    auVar122 = vmulps_avx512vl(auVar115,auVar98);
    auVar123 = vmulps_avx512vl(auVar122,auVar96);
    auVar123 = vsubps_avx512vl(auVar120,auVar123);
    auVar83 = vxorps_avx512vl(auVar98._0_16_,auVar98._0_16_);
    uVar61 = vcmpps_avx512vl(auVar123,auVar124,5);
    bVar49 = (byte)uVar61;
    if (bVar49 == 0) {
LAB_018deae6:
      auVar167 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
      auVar99 = vmovdqa64_avx512vl(auVar85);
      auVar285 = ZEXT3264(auVar99);
      auVar99 = vmovdqa64_avx512vl(auVar86);
      auVar286 = ZEXT3264(auVar99);
    }
    else {
      local_780._0_32_ = auVar120;
      auVar123 = vsqrtps_avx512vl(auVar123);
      auVar124 = vaddps_avx512vl(auVar115,auVar115);
      _local_840 = vrcp14ps_avx512vl(auVar124);
      auVar98._8_4_ = 0x3f800000;
      auVar98._0_8_ = 0x3f8000003f800000;
      auVar98._12_4_ = 0x3f800000;
      auVar98._16_4_ = 0x3f800000;
      auVar98._20_4_ = 0x3f800000;
      auVar98._24_4_ = 0x3f800000;
      auVar98._28_4_ = 0x3f800000;
      auVar98 = vfnmadd213ps_avx512vl(_local_840,auVar124,auVar98);
      auVar98 = vfmadd132ps_avx512vl(auVar98,_local_840,_local_840);
      local_860 = vxorps_avx512vl(auVar119,auVar106);
      auVar106 = vsubps_avx512vl(local_860,auVar123);
      local_820 = vmulps_avx512vl(auVar106,auVar98);
      auVar106 = vsubps_avx512vl(auVar123,auVar119);
      local_880 = vmulps_avx512vl(auVar106,auVar98);
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar98 = vblendmps_avx512vl(auVar106,local_820);
      auVar125._0_4_ =
           (uint)(bVar49 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar49 & 1) * auVar106._0_4_;
      bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar60 * auVar98._4_4_ | (uint)!bVar60 * auVar106._4_4_;
      bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar60 * auVar98._8_4_ | (uint)!bVar60 * auVar106._8_4_;
      bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar60 * auVar98._12_4_ | (uint)!bVar60 * auVar106._12_4_;
      bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar125._16_4_ = (uint)bVar60 * auVar98._16_4_ | (uint)!bVar60 * auVar106._16_4_;
      bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar125._20_4_ = (uint)bVar60 * auVar98._20_4_ | (uint)!bVar60 * auVar106._20_4_;
      bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar125._24_4_ = (uint)bVar60 * auVar98._24_4_ | (uint)!bVar60 * auVar106._24_4_;
      bVar60 = SUB81(uVar61 >> 7,0);
      auVar125._28_4_ = (uint)bVar60 * auVar98._28_4_ | (uint)!bVar60 * auVar106._28_4_;
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar98 = vblendmps_avx512vl(auVar106,local_880);
      auVar126._0_4_ =
           (uint)(bVar49 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar49 & 1) * auVar106._0_4_;
      bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar60 * auVar98._4_4_ | (uint)!bVar60 * auVar106._4_4_;
      bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar60 * auVar98._8_4_ | (uint)!bVar60 * auVar106._8_4_;
      bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar60 * auVar98._12_4_ | (uint)!bVar60 * auVar106._12_4_;
      bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar126._16_4_ = (uint)bVar60 * auVar98._16_4_ | (uint)!bVar60 * auVar106._16_4_;
      bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar126._20_4_ = (uint)bVar60 * auVar98._20_4_ | (uint)!bVar60 * auVar106._20_4_;
      bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar126._24_4_ = (uint)bVar60 * auVar98._24_4_ | (uint)!bVar60 * auVar106._24_4_;
      bVar60 = SUB81(uVar61 >> 7,0);
      auVar126._28_4_ = (uint)bVar60 * auVar98._28_4_ | (uint)!bVar60 * auVar106._28_4_;
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar114,auVar106);
      local_8a0 = vmaxps_avx512vl(local_580,auVar106);
      auVar123._8_4_ = 0x36000000;
      auVar123._0_8_ = 0x3600000036000000;
      auVar123._12_4_ = 0x36000000;
      auVar123._16_4_ = 0x36000000;
      auVar123._20_4_ = 0x36000000;
      auVar123._24_4_ = 0x36000000;
      auVar123._28_4_ = 0x36000000;
      local_940 = vmulps_avx512vl(local_8a0,auVar123);
      vandps_avx512vl(auVar115,auVar106);
      uVar57 = vcmpps_avx512vl(local_940,local_940,1);
      uVar61 = uVar61 & uVar57;
      bVar58 = (byte)uVar61;
      if (bVar58 != 0) {
        uVar57 = vcmpps_avx512vl(auVar96,ZEXT1632(auVar83),2);
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar115 = vblendmps_avx512vl(auVar96,auVar114);
        bVar53 = (byte)uVar57;
        uVar62 = (uint)(bVar53 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar53 & 1) * local_940._0_4_;
        bVar60 = (bool)((byte)(uVar57 >> 1) & 1);
        uVar142 = (uint)bVar60 * auVar115._4_4_ | (uint)!bVar60 * local_940._4_4_;
        bVar60 = (bool)((byte)(uVar57 >> 2) & 1);
        uVar143 = (uint)bVar60 * auVar115._8_4_ | (uint)!bVar60 * local_940._8_4_;
        bVar60 = (bool)((byte)(uVar57 >> 3) & 1);
        uVar144 = (uint)bVar60 * auVar115._12_4_ | (uint)!bVar60 * local_940._12_4_;
        bVar60 = (bool)((byte)(uVar57 >> 4) & 1);
        uVar145 = (uint)bVar60 * auVar115._16_4_ | (uint)!bVar60 * local_940._16_4_;
        bVar60 = (bool)((byte)(uVar57 >> 5) & 1);
        uVar146 = (uint)bVar60 * auVar115._20_4_ | (uint)!bVar60 * local_940._20_4_;
        bVar60 = (bool)((byte)(uVar57 >> 6) & 1);
        uVar147 = (uint)bVar60 * auVar115._24_4_ | (uint)!bVar60 * local_940._24_4_;
        bVar60 = SUB81(uVar57 >> 7,0);
        uVar148 = (uint)bVar60 * auVar115._28_4_ | (uint)!bVar60 * local_940._28_4_;
        auVar125._0_4_ = (bVar58 & 1) * uVar62 | !(bool)(bVar58 & 1) * auVar125._0_4_;
        bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar125._4_4_ = bVar60 * uVar142 | !bVar60 * auVar125._4_4_;
        bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar125._8_4_ = bVar60 * uVar143 | !bVar60 * auVar125._8_4_;
        bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar125._12_4_ = bVar60 * uVar144 | !bVar60 * auVar125._12_4_;
        bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar125._16_4_ = bVar60 * uVar145 | !bVar60 * auVar125._16_4_;
        bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar125._20_4_ = bVar60 * uVar146 | !bVar60 * auVar125._20_4_;
        bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar125._24_4_ = bVar60 * uVar147 | !bVar60 * auVar125._24_4_;
        bVar60 = SUB81(uVar61 >> 7,0);
        auVar125._28_4_ = bVar60 * uVar148 | !bVar60 * auVar125._28_4_;
        auVar96 = vblendmps_avx512vl(auVar114,auVar96);
        bVar60 = (bool)((byte)(uVar57 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar57 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar57 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar57 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar57 >> 6) & 1);
        bVar16 = SUB81(uVar57 >> 7,0);
        auVar126._0_4_ =
             (uint)(bVar58 & 1) *
             ((uint)(bVar53 & 1) * auVar96._0_4_ | !(bool)(bVar53 & 1) * uVar62) |
             !(bool)(bVar58 & 1) * auVar126._0_4_;
        bVar10 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar126._4_4_ =
             (uint)bVar10 * ((uint)bVar60 * auVar96._4_4_ | !bVar60 * uVar142) |
             !bVar10 * auVar126._4_4_;
        bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar126._8_4_ =
             (uint)bVar60 * ((uint)bVar11 * auVar96._8_4_ | !bVar11 * uVar143) |
             !bVar60 * auVar126._8_4_;
        bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar126._12_4_ =
             (uint)bVar60 * ((uint)bVar12 * auVar96._12_4_ | !bVar12 * uVar144) |
             !bVar60 * auVar126._12_4_;
        bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar126._16_4_ =
             (uint)bVar60 * ((uint)bVar13 * auVar96._16_4_ | !bVar13 * uVar145) |
             !bVar60 * auVar126._16_4_;
        bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar126._20_4_ =
             (uint)bVar60 * ((uint)bVar14 * auVar96._20_4_ | !bVar14 * uVar146) |
             !bVar60 * auVar126._20_4_;
        bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar126._24_4_ =
             (uint)bVar60 * ((uint)bVar15 * auVar96._24_4_ | !bVar15 * uVar147) |
             !bVar60 * auVar126._24_4_;
        bVar60 = SUB81(uVar61 >> 7,0);
        auVar126._28_4_ =
             (uint)bVar60 * ((uint)bVar16 * auVar96._28_4_ | !bVar16 * uVar148) |
             !bVar60 * auVar126._28_4_;
        bVar49 = (~bVar58 | bVar53) & bVar49;
      }
      if ((bVar49 & 0x7f) == 0) {
        auVar167 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar99 = vmovdqa64_avx512vl(auVar85);
        auVar285 = ZEXT3264(auVar99);
        auVar99 = vmovdqa64_avx512vl(auVar86);
        auVar286 = ZEXT3264(auVar99);
      }
      else {
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar113 = vxorps_avx512vl(auVar113,auVar106);
        auVar111 = vxorps_avx512vl(auVar111,auVar106);
        auVar167 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
        auVar112 = vxorps_avx512vl(auVar112,auVar106);
        auVar83 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                                 ZEXT416((uint)local_910._0_4_));
        auVar96 = vbroadcastss_avx512vl(auVar83);
        auVar96 = vminps_avx512vl(auVar96,auVar126);
        auVar48._4_4_ = fStack_61c;
        auVar48._0_4_ = local_620;
        auVar48._8_4_ = fStack_618;
        auVar48._12_4_ = fStack_614;
        auVar48._16_4_ = fStack_610;
        auVar48._20_4_ = fStack_60c;
        auVar48._24_4_ = fStack_608;
        auVar48._28_4_ = fStack_604;
        auVar114 = vmaxps_avx512vl(auVar48,auVar125);
        auVar115 = vmulps_avx512vl(auVar129,auVar118);
        auVar115 = vfmadd213ps_avx512vl(auVar117,auVar128,auVar115);
        auVar83 = vfmadd213ps_fma(auVar116,auVar127,auVar115);
        auVar115 = vmulps_avx512vl(local_800,auVar129);
        auVar115 = vfmadd231ps_avx512vl(auVar115,local_7e0,auVar128);
        auVar115 = vfmadd231ps_avx512vl(auVar115,local_7c0,auVar127);
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar115,auVar116);
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar19 = vcmpps_avx512vl(auVar116,auVar117,1);
        auVar127 = vxorps_avx512vl(ZEXT1632(auVar83),auVar106);
        auVar128 = vrcp14ps_avx512vl(auVar115);
        auVar129 = vxorps_avx512vl(auVar115,auVar106);
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar98 = vfnmadd213ps_avx512vl(auVar128,auVar115,auVar118);
        auVar83 = vfmadd132ps_fma(auVar98,auVar128,auVar128);
        fVar258 = auVar83._0_4_ * auVar127._0_4_;
        fVar263 = auVar83._4_4_ * auVar127._4_4_;
        auVar34._4_4_ = fVar263;
        auVar34._0_4_ = fVar258;
        fVar264 = auVar83._8_4_ * auVar127._8_4_;
        auVar34._8_4_ = fVar264;
        fVar265 = auVar83._12_4_ * auVar127._12_4_;
        auVar34._12_4_ = fVar265;
        fVar234 = auVar127._16_4_ * 0.0;
        auVar34._16_4_ = fVar234;
        fVar235 = auVar127._20_4_ * 0.0;
        auVar34._20_4_ = fVar235;
        fVar236 = auVar127._24_4_ * 0.0;
        auVar34._24_4_ = fVar236;
        auVar34._28_4_ = auVar127._28_4_;
        uVar21 = vcmpps_avx512vl(auVar115,auVar129,1);
        bVar58 = (byte)uVar19 | (byte)uVar21;
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar123 = vblendmps_avx512vl(auVar34,auVar98);
        auVar130._0_4_ =
             (uint)(bVar58 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar128._0_4_;
        bVar60 = (bool)(bVar58 >> 1 & 1);
        auVar130._4_4_ = (uint)bVar60 * auVar123._4_4_ | (uint)!bVar60 * auVar128._4_4_;
        bVar60 = (bool)(bVar58 >> 2 & 1);
        auVar130._8_4_ = (uint)bVar60 * auVar123._8_4_ | (uint)!bVar60 * auVar128._8_4_;
        bVar60 = (bool)(bVar58 >> 3 & 1);
        auVar130._12_4_ = (uint)bVar60 * auVar123._12_4_ | (uint)!bVar60 * auVar128._12_4_;
        bVar60 = (bool)(bVar58 >> 4 & 1);
        auVar130._16_4_ = (uint)bVar60 * auVar123._16_4_ | (uint)!bVar60 * auVar128._16_4_;
        bVar60 = (bool)(bVar58 >> 5 & 1);
        auVar130._20_4_ = (uint)bVar60 * auVar123._20_4_ | (uint)!bVar60 * auVar128._20_4_;
        bVar60 = (bool)(bVar58 >> 6 & 1);
        auVar130._24_4_ = (uint)bVar60 * auVar123._24_4_ | (uint)!bVar60 * auVar128._24_4_;
        auVar130._28_4_ =
             (uint)(bVar58 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar58 >> 7) * auVar128._28_4_;
        auVar128 = vmaxps_avx512vl(auVar114,auVar130);
        auVar279 = ZEXT3264(auVar128);
        uVar21 = vcmpps_avx512vl(auVar115,auVar129,6);
        bVar58 = (byte)uVar19 | (byte)uVar21;
        auVar129 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar131._0_4_ =
             (uint)(bVar58 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar58 & 1) * (int)fVar258;
        bVar60 = (bool)(bVar58 >> 1 & 1);
        auVar131._4_4_ = (uint)bVar60 * auVar129._4_4_ | (uint)!bVar60 * (int)fVar263;
        bVar60 = (bool)(bVar58 >> 2 & 1);
        auVar131._8_4_ = (uint)bVar60 * auVar129._8_4_ | (uint)!bVar60 * (int)fVar264;
        bVar60 = (bool)(bVar58 >> 3 & 1);
        auVar131._12_4_ = (uint)bVar60 * auVar129._12_4_ | (uint)!bVar60 * (int)fVar265;
        bVar60 = (bool)(bVar58 >> 4 & 1);
        auVar131._16_4_ = (uint)bVar60 * auVar129._16_4_ | (uint)!bVar60 * (int)fVar234;
        bVar60 = (bool)(bVar58 >> 5 & 1);
        auVar131._20_4_ = (uint)bVar60 * auVar129._20_4_ | (uint)!bVar60 * (int)fVar235;
        bVar60 = (bool)(bVar58 >> 6 & 1);
        auVar131._24_4_ = (uint)bVar60 * auVar129._24_4_ | (uint)!bVar60 * (int)fVar236;
        auVar131._28_4_ =
             (uint)(bVar58 >> 7) * auVar129._28_4_ | (uint)!(bool)(bVar58 >> 7) * auVar127._28_4_;
        auVar127 = vminps_avx512vl(auVar96,auVar131);
        auVar96 = vsubps_avx(ZEXT832(0) << 0x20,auVar108);
        auVar114 = vsubps_avx(ZEXT832(0) << 0x20,auVar109);
        auVar108 = ZEXT832(0) << 0x20;
        auVar115 = vsubps_avx(auVar108,auVar110);
        auVar115 = vmulps_avx512vl(auVar115,auVar113);
        auVar114 = vfmadd231ps_avx512vl(auVar115,auVar112,auVar114);
        auVar96 = vfmadd231ps_avx512vl(auVar114,auVar111,auVar96);
        auVar114 = vmulps_avx512vl(local_800,auVar113);
        auVar114 = vfmadd231ps_avx512vl(auVar114,local_7e0,auVar112);
        auVar114 = vfmadd231ps_avx512vl(auVar114,local_7c0,auVar111);
        vandps_avx512vl(auVar114,auVar116);
        uVar19 = vcmpps_avx512vl(auVar114,auVar117,1);
        auVar115 = vxorps_avx512vl(auVar96,auVar106);
        auVar96 = vrcp14ps_avx512vl(auVar114);
        auVar116 = vxorps_avx512vl(auVar114,auVar106);
        auVar274 = ZEXT3264(auVar116);
        auVar106 = vfnmadd213ps_avx512vl(auVar96,auVar114,auVar118);
        auVar83 = vfmadd132ps_fma(auVar106,auVar96,auVar96);
        fVar258 = auVar83._0_4_ * auVar115._0_4_;
        fVar263 = auVar83._4_4_ * auVar115._4_4_;
        auVar35._4_4_ = fVar263;
        auVar35._0_4_ = fVar258;
        fVar264 = auVar83._8_4_ * auVar115._8_4_;
        auVar35._8_4_ = fVar264;
        fVar265 = auVar83._12_4_ * auVar115._12_4_;
        auVar35._12_4_ = fVar265;
        fVar234 = auVar115._16_4_ * 0.0;
        auVar35._16_4_ = fVar234;
        fVar235 = auVar115._20_4_ * 0.0;
        auVar35._20_4_ = fVar235;
        fVar236 = auVar115._24_4_ * 0.0;
        auVar35._24_4_ = fVar236;
        auVar35._28_4_ = auVar115._28_4_;
        uVar21 = vcmpps_avx512vl(auVar114,auVar116,1);
        bVar58 = (byte)uVar19 | (byte)uVar21;
        auVar106 = vblendmps_avx512vl(auVar35,auVar98);
        auVar132._0_4_ =
             (uint)(bVar58 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar96._0_4_;
        bVar60 = (bool)(bVar58 >> 1 & 1);
        auVar132._4_4_ = (uint)bVar60 * auVar106._4_4_ | (uint)!bVar60 * auVar96._4_4_;
        bVar60 = (bool)(bVar58 >> 2 & 1);
        auVar132._8_4_ = (uint)bVar60 * auVar106._8_4_ | (uint)!bVar60 * auVar96._8_4_;
        bVar60 = (bool)(bVar58 >> 3 & 1);
        auVar132._12_4_ = (uint)bVar60 * auVar106._12_4_ | (uint)!bVar60 * auVar96._12_4_;
        bVar60 = (bool)(bVar58 >> 4 & 1);
        auVar132._16_4_ = (uint)bVar60 * auVar106._16_4_ | (uint)!bVar60 * auVar96._16_4_;
        bVar60 = (bool)(bVar58 >> 5 & 1);
        auVar132._20_4_ = (uint)bVar60 * auVar106._20_4_ | (uint)!bVar60 * auVar96._20_4_;
        bVar60 = (bool)(bVar58 >> 6 & 1);
        auVar132._24_4_ = (uint)bVar60 * auVar106._24_4_ | (uint)!bVar60 * auVar96._24_4_;
        auVar132._28_4_ =
             (uint)(bVar58 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar58 >> 7) * auVar96._28_4_;
        auVar96 = vmaxps_avx(auVar128,auVar132);
        auVar270 = ZEXT3264(auVar96);
        uVar21 = vcmpps_avx512vl(auVar114,auVar116,6);
        bVar58 = (byte)uVar19 | (byte)uVar21;
        auVar133._0_4_ =
             (uint)(bVar58 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar58 & 1) * (int)fVar258;
        bVar60 = (bool)(bVar58 >> 1 & 1);
        auVar133._4_4_ = (uint)bVar60 * auVar129._4_4_ | (uint)!bVar60 * (int)fVar263;
        bVar60 = (bool)(bVar58 >> 2 & 1);
        auVar133._8_4_ = (uint)bVar60 * auVar129._8_4_ | (uint)!bVar60 * (int)fVar264;
        bVar60 = (bool)(bVar58 >> 3 & 1);
        auVar133._12_4_ = (uint)bVar60 * auVar129._12_4_ | (uint)!bVar60 * (int)fVar265;
        bVar60 = (bool)(bVar58 >> 4 & 1);
        auVar133._16_4_ = (uint)bVar60 * auVar129._16_4_ | (uint)!bVar60 * (int)fVar234;
        bVar60 = (bool)(bVar58 >> 5 & 1);
        auVar133._20_4_ = (uint)bVar60 * auVar129._20_4_ | (uint)!bVar60 * (int)fVar235;
        bVar60 = (bool)(bVar58 >> 6 & 1);
        auVar133._24_4_ = (uint)bVar60 * auVar129._24_4_ | (uint)!bVar60 * (int)fVar236;
        auVar133._28_4_ =
             (uint)(bVar58 >> 7) * auVar129._28_4_ | (uint)!(bool)(bVar58 >> 7) * auVar115._28_4_;
        local_660 = vminps_avx(auVar127,auVar133);
        auVar268 = ZEXT3264(local_660);
        uVar19 = vcmpps_avx512vl(auVar96,local_660,2);
        bVar49 = bVar49 & 0x7f & (byte)uVar19;
        if (bVar49 == 0) goto LAB_018deae6;
        auVar99 = vmaxps_avx(auVar108,auVar99);
        auVar114 = vfmadd213ps_avx512vl(local_820,auVar121,auVar102);
        fVar258 = auVar101._0_4_;
        fVar263 = auVar101._4_4_;
        auVar36._4_4_ = fVar263 * auVar114._4_4_;
        auVar36._0_4_ = fVar258 * auVar114._0_4_;
        fVar264 = auVar101._8_4_;
        auVar36._8_4_ = fVar264 * auVar114._8_4_;
        fVar265 = auVar101._12_4_;
        auVar36._12_4_ = fVar265 * auVar114._12_4_;
        fVar234 = auVar101._16_4_;
        auVar36._16_4_ = fVar234 * auVar114._16_4_;
        fVar235 = auVar101._20_4_;
        auVar36._20_4_ = fVar235 * auVar114._20_4_;
        fVar236 = auVar101._24_4_;
        auVar36._24_4_ = fVar236 * auVar114._24_4_;
        auVar36._28_4_ = auVar114._28_4_;
        auVar114 = vfmadd213ps_avx512vl(local_880,auVar121,auVar102);
        auVar37._4_4_ = fVar263 * auVar114._4_4_;
        auVar37._0_4_ = fVar258 * auVar114._0_4_;
        auVar37._8_4_ = fVar264 * auVar114._8_4_;
        auVar37._12_4_ = fVar265 * auVar114._12_4_;
        auVar37._16_4_ = fVar234 * auVar114._16_4_;
        auVar37._20_4_ = fVar235 * auVar114._20_4_;
        auVar37._24_4_ = fVar236 * auVar114._24_4_;
        auVar37._28_4_ = auVar114._28_4_;
        auVar114 = vminps_avx512vl(auVar36,auVar118);
        auVar115 = ZEXT832(0) << 0x20;
        auVar114 = vmaxps_avx(auVar114,ZEXT832(0) << 0x20);
        auVar116 = vminps_avx512vl(auVar37,auVar118);
        auVar38._4_4_ = (auVar114._4_4_ + 1.0) * 0.125;
        auVar38._0_4_ = (auVar114._0_4_ + 0.0) * 0.125;
        auVar38._8_4_ = (auVar114._8_4_ + 2.0) * 0.125;
        auVar38._12_4_ = (auVar114._12_4_ + 3.0) * 0.125;
        auVar38._16_4_ = (auVar114._16_4_ + 4.0) * 0.125;
        auVar38._20_4_ = (auVar114._20_4_ + 5.0) * 0.125;
        auVar38._24_4_ = (auVar114._24_4_ + 6.0) * 0.125;
        auVar38._28_4_ = auVar114._28_4_ + 7.0;
        local_520 = vfmadd213ps_avx512vl(auVar38,auVar159,auVar240);
        auVar114 = vmaxps_avx(auVar116,ZEXT832(0) << 0x20);
        auVar39._4_4_ = (auVar114._4_4_ + 1.0) * 0.125;
        auVar39._0_4_ = (auVar114._0_4_ + 0.0) * 0.125;
        auVar39._8_4_ = (auVar114._8_4_ + 2.0) * 0.125;
        auVar39._12_4_ = (auVar114._12_4_ + 3.0) * 0.125;
        auVar39._16_4_ = (auVar114._16_4_ + 4.0) * 0.125;
        auVar39._20_4_ = (auVar114._20_4_ + 5.0) * 0.125;
        auVar39._24_4_ = (auVar114._24_4_ + 6.0) * 0.125;
        auVar39._28_4_ = auVar114._28_4_ + 7.0;
        local_540 = vfmadd213ps_avx512vl(auVar39,auVar159,auVar240);
        auVar40._4_4_ = auVar99._4_4_ * auVar99._4_4_;
        auVar40._0_4_ = auVar99._0_4_ * auVar99._0_4_;
        auVar40._8_4_ = auVar99._8_4_ * auVar99._8_4_;
        auVar40._12_4_ = auVar99._12_4_ * auVar99._12_4_;
        auVar40._16_4_ = auVar99._16_4_ * auVar99._16_4_;
        auVar40._20_4_ = auVar99._20_4_ * auVar99._20_4_;
        auVar40._24_4_ = auVar99._24_4_ * auVar99._24_4_;
        auVar40._28_4_ = auVar99._28_4_;
        auVar114 = vsubps_avx(local_a00,auVar40);
        local_a80 = auVar122._0_4_;
        fStack_a7c = auVar122._4_4_;
        fStack_a78 = auVar122._8_4_;
        fStack_a74 = auVar122._12_4_;
        fStack_a70 = auVar122._16_4_;
        fStack_a6c = auVar122._20_4_;
        fStack_a68 = auVar122._24_4_;
        auVar41._4_4_ = auVar114._4_4_ * fStack_a7c;
        auVar41._0_4_ = auVar114._0_4_ * local_a80;
        auVar41._8_4_ = auVar114._8_4_ * fStack_a78;
        auVar41._12_4_ = auVar114._12_4_ * fStack_a74;
        auVar41._16_4_ = auVar114._16_4_ * fStack_a70;
        auVar41._20_4_ = auVar114._20_4_ * fStack_a6c;
        auVar41._24_4_ = auVar114._24_4_ * fStack_a68;
        auVar41._28_4_ = auVar99._28_4_;
        auVar99 = vsubps_avx(auVar120,auVar41);
        uVar19 = vcmpps_avx512vl(auVar99,ZEXT832(0) << 0x20,5);
        bVar58 = (byte)uVar19;
        if (bVar58 == 0) {
          bVar58 = 0;
          auVar97 = ZEXT832(0) << 0x20;
          auVar139 = ZEXT864(0) << 0x20;
          auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar116 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar270 = ZEXT864(0) << 0x20;
          auVar124._8_4_ = 0x7f800000;
          auVar124._0_8_ = 0x7f8000007f800000;
          auVar124._12_4_ = 0x7f800000;
          auVar124._16_4_ = 0x7f800000;
          auVar124._20_4_ = 0x7f800000;
          auVar124._24_4_ = 0x7f800000;
          auVar124._28_4_ = 0x7f800000;
          auVar134._8_4_ = 0xff800000;
          auVar134._0_8_ = 0xff800000ff800000;
          auVar134._12_4_ = 0xff800000;
          auVar134._16_4_ = 0xff800000;
          auVar134._20_4_ = 0xff800000;
          auVar134._24_4_ = 0xff800000;
          auVar134._28_4_ = 0xff800000;
        }
        else {
          auVar79 = vxorps_avx512vl(auVar152,auVar152);
          uVar61 = vcmpps_avx512vl(auVar99,auVar108,5);
          auVar99 = vsqrtps_avx(auVar99);
          auVar115 = vfnmadd213ps_avx512vl(auVar124,_local_840,auVar118);
          auVar83 = vfmadd132ps_fma(auVar115,_local_840,_local_840);
          auVar115 = vsubps_avx(local_860,auVar99);
          auVar42._4_4_ = auVar83._4_4_ * auVar115._4_4_;
          auVar42._0_4_ = auVar83._0_4_ * auVar115._0_4_;
          auVar42._8_4_ = auVar83._8_4_ * auVar115._8_4_;
          auVar42._12_4_ = auVar83._12_4_ * auVar115._12_4_;
          auVar42._16_4_ = auVar115._16_4_ * 0.0;
          auVar42._20_4_ = auVar115._20_4_ * 0.0;
          auVar42._24_4_ = auVar115._24_4_ * 0.0;
          auVar42._28_4_ = 0x3e000000;
          auVar99 = vsubps_avx512vl(auVar99,auVar119);
          auVar283._0_4_ = auVar83._0_4_ * auVar99._0_4_;
          auVar283._4_4_ = auVar83._4_4_ * auVar99._4_4_;
          auVar283._8_4_ = auVar83._8_4_ * auVar99._8_4_;
          auVar283._12_4_ = auVar83._12_4_ * auVar99._12_4_;
          auVar283._16_4_ = auVar99._16_4_ * 0.0;
          auVar283._20_4_ = auVar99._20_4_ * 0.0;
          auVar283._24_4_ = auVar99._24_4_ * 0.0;
          auVar283._28_4_ = 0;
          auVar99 = vfmadd213ps_avx512vl(auVar121,auVar42,auVar102);
          auVar269._0_4_ = fVar258 * auVar99._0_4_;
          auVar269._4_4_ = fVar263 * auVar99._4_4_;
          auVar269._8_4_ = fVar264 * auVar99._8_4_;
          auVar269._12_4_ = fVar265 * auVar99._12_4_;
          auVar269._16_4_ = fVar234 * auVar99._16_4_;
          auVar269._20_4_ = fVar235 * auVar99._20_4_;
          auVar269._24_4_ = fVar236 * auVar99._24_4_;
          auVar269._28_4_ = 0;
          auVar99 = vmulps_avx512vl(local_7c0,auVar42);
          auVar115 = vmulps_avx512vl(local_7e0,auVar42);
          auVar106 = vmulps_avx512vl(local_800,auVar42);
          auVar116 = vfmadd213ps_avx512vl(auVar97,auVar269,auVar103);
          auVar99 = vsubps_avx512vl(auVar99,auVar116);
          auVar116 = vfmadd213ps_avx512vl(auVar100,auVar269,auVar104);
          auVar116 = vsubps_avx512vl(auVar115,auVar116);
          auVar83 = vfmadd213ps_fma(auVar269,auVar107,auVar105);
          auVar115 = vsubps_avx(auVar106,ZEXT1632(auVar83));
          auVar270 = ZEXT3264(auVar115);
          auVar102 = vfmadd213ps_avx512vl(auVar121,auVar283,auVar102);
          auVar101 = vmulps_avx512vl(auVar101,auVar102);
          auVar102 = vmulps_avx512vl(local_7c0,auVar283);
          auVar106 = vmulps_avx512vl(local_7e0,auVar283);
          auVar108 = vmulps_avx512vl(local_800,auVar283);
          auVar83 = vfmadd213ps_fma(auVar97,auVar101,auVar103);
          auVar115 = vsubps_avx(auVar102,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar100,auVar101,auVar104);
          auVar97 = vsubps_avx512vl(auVar106,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar107,auVar101,auVar105);
          auVar100 = vsubps_avx512vl(auVar108,ZEXT1632(auVar83));
          auVar139 = ZEXT3264(auVar100);
          auVar160._8_4_ = 0x7f800000;
          auVar160._0_8_ = 0x7f8000007f800000;
          auVar160._12_4_ = 0x7f800000;
          auVar160._16_4_ = 0x7f800000;
          auVar160._20_4_ = 0x7f800000;
          auVar160._24_4_ = 0x7f800000;
          auVar160._28_4_ = 0x7f800000;
          auVar100 = vblendmps_avx512vl(auVar160,auVar42);
          bVar60 = (bool)((byte)uVar61 & 1);
          auVar124._0_4_ = (uint)bVar60 * auVar100._0_4_ | (uint)!bVar60 * 0x7f800000;
          bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar60 * auVar100._4_4_ | (uint)!bVar60 * 0x7f800000;
          bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar60 * auVar100._8_4_ | (uint)!bVar60 * 0x7f800000;
          bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar60 * auVar100._12_4_ | (uint)!bVar60 * 0x7f800000;
          bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar60 * auVar100._16_4_ | (uint)!bVar60 * 0x7f800000;
          bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar60 * auVar100._20_4_ | (uint)!bVar60 * 0x7f800000;
          bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar60 * auVar100._24_4_ | (uint)!bVar60 * 0x7f800000;
          bVar60 = SUB81(uVar61 >> 7,0);
          auVar124._28_4_ = (uint)bVar60 * auVar100._28_4_ | (uint)!bVar60 * 0x7f800000;
          auVar214._8_4_ = 0xff800000;
          auVar214._0_8_ = 0xff800000ff800000;
          auVar214._12_4_ = 0xff800000;
          auVar214._16_4_ = 0xff800000;
          auVar214._20_4_ = 0xff800000;
          auVar214._24_4_ = 0xff800000;
          auVar214._28_4_ = 0xff800000;
          auVar100 = vblendmps_avx512vl(auVar214,auVar283);
          bVar60 = (bool)((byte)uVar61 & 1);
          auVar134._0_4_ = (uint)bVar60 * auVar100._0_4_ | (uint)!bVar60 * -0x800000;
          bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar134._4_4_ = (uint)bVar60 * auVar100._4_4_ | (uint)!bVar60 * -0x800000;
          bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar134._8_4_ = (uint)bVar60 * auVar100._8_4_ | (uint)!bVar60 * -0x800000;
          bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar134._12_4_ = (uint)bVar60 * auVar100._12_4_ | (uint)!bVar60 * -0x800000;
          bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
          auVar134._16_4_ = (uint)bVar60 * auVar100._16_4_ | (uint)!bVar60 * -0x800000;
          bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
          auVar134._20_4_ = (uint)bVar60 * auVar100._20_4_ | (uint)!bVar60 * -0x800000;
          bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
          auVar134._24_4_ = (uint)bVar60 * auVar100._24_4_ | (uint)!bVar60 * -0x800000;
          bVar60 = SUB81(uVar61 >> 7,0);
          auVar134._28_4_ = (uint)bVar60 * auVar100._28_4_ | (uint)!bVar60 * -0x800000;
          auVar30._8_4_ = 0x36000000;
          auVar30._0_8_ = 0x3600000036000000;
          auVar30._12_4_ = 0x36000000;
          auVar30._16_4_ = 0x36000000;
          auVar30._20_4_ = 0x36000000;
          auVar30._24_4_ = 0x36000000;
          auVar30._28_4_ = 0x36000000;
          auVar100 = vmulps_avx512vl(local_8a0,auVar30);
          uVar57 = vcmpps_avx512vl(auVar100,local_940,0xe);
          uVar61 = uVar61 & uVar57;
          bVar53 = (byte)uVar61;
          if (bVar53 != 0) {
            uVar57 = vcmpps_avx512vl(auVar114,ZEXT1632(auVar79),2);
            auVar261._8_4_ = 0x7f800000;
            auVar261._0_8_ = 0x7f8000007f800000;
            auVar261._12_4_ = 0x7f800000;
            auVar261._16_4_ = 0x7f800000;
            auVar261._20_4_ = 0x7f800000;
            auVar261._24_4_ = 0x7f800000;
            auVar261._28_4_ = 0x7f800000;
            auVar278._8_4_ = 0xff800000;
            auVar278._0_8_ = 0xff800000ff800000;
            auVar278._12_4_ = 0xff800000;
            auVar278._16_4_ = 0xff800000;
            auVar278._20_4_ = 0xff800000;
            auVar278._24_4_ = 0xff800000;
            auVar278._28_4_ = 0xff800000;
            auVar107 = vblendmps_avx512vl(auVar261,auVar278);
            bVar50 = (byte)uVar57;
            uVar62 = (uint)(bVar50 & 1) * auVar107._0_4_ |
                     (uint)!(bool)(bVar50 & 1) * auVar100._0_4_;
            bVar60 = (bool)((byte)(uVar57 >> 1) & 1);
            uVar142 = (uint)bVar60 * auVar107._4_4_ | (uint)!bVar60 * auVar100._4_4_;
            bVar60 = (bool)((byte)(uVar57 >> 2) & 1);
            uVar143 = (uint)bVar60 * auVar107._8_4_ | (uint)!bVar60 * auVar100._8_4_;
            bVar60 = (bool)((byte)(uVar57 >> 3) & 1);
            uVar144 = (uint)bVar60 * auVar107._12_4_ | (uint)!bVar60 * auVar100._12_4_;
            bVar60 = (bool)((byte)(uVar57 >> 4) & 1);
            uVar145 = (uint)bVar60 * auVar107._16_4_ | (uint)!bVar60 * auVar100._16_4_;
            bVar60 = (bool)((byte)(uVar57 >> 5) & 1);
            uVar146 = (uint)bVar60 * auVar107._20_4_ | (uint)!bVar60 * auVar100._20_4_;
            bVar60 = (bool)((byte)(uVar57 >> 6) & 1);
            uVar147 = (uint)bVar60 * auVar107._24_4_ | (uint)!bVar60 * auVar100._24_4_;
            bVar60 = SUB81(uVar57 >> 7,0);
            uVar148 = (uint)bVar60 * auVar107._28_4_ | (uint)!bVar60 * auVar100._28_4_;
            auVar124._0_4_ = (bVar53 & 1) * uVar62 | !(bool)(bVar53 & 1) * auVar124._0_4_;
            bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar124._4_4_ = bVar60 * uVar142 | !bVar60 * auVar124._4_4_;
            bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar124._8_4_ = bVar60 * uVar143 | !bVar60 * auVar124._8_4_;
            bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar124._12_4_ = bVar60 * uVar144 | !bVar60 * auVar124._12_4_;
            bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar124._16_4_ = bVar60 * uVar145 | !bVar60 * auVar124._16_4_;
            bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar124._20_4_ = bVar60 * uVar146 | !bVar60 * auVar124._20_4_;
            bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar124._24_4_ = bVar60 * uVar147 | !bVar60 * auVar124._24_4_;
            bVar60 = SUB81(uVar61 >> 7,0);
            auVar124._28_4_ = bVar60 * uVar148 | !bVar60 * auVar124._28_4_;
            auVar100 = vblendmps_avx512vl(auVar278,auVar261);
            bVar60 = (bool)((byte)(uVar57 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar57 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar57 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar57 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar57 >> 6) & 1);
            bVar16 = SUB81(uVar57 >> 7,0);
            auVar134._0_4_ =
                 (uint)(bVar53 & 1) *
                 ((uint)(bVar50 & 1) * auVar100._0_4_ | !(bool)(bVar50 & 1) * uVar62) |
                 !(bool)(bVar53 & 1) * auVar134._0_4_;
            bVar10 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar134._4_4_ =
                 (uint)bVar10 * ((uint)bVar60 * auVar100._4_4_ | !bVar60 * uVar142) |
                 !bVar10 * auVar134._4_4_;
            bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar134._8_4_ =
                 (uint)bVar60 * ((uint)bVar11 * auVar100._8_4_ | !bVar11 * uVar143) |
                 !bVar60 * auVar134._8_4_;
            bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar134._12_4_ =
                 (uint)bVar60 * ((uint)bVar12 * auVar100._12_4_ | !bVar12 * uVar144) |
                 !bVar60 * auVar134._12_4_;
            bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar134._16_4_ =
                 (uint)bVar60 * ((uint)bVar13 * auVar100._16_4_ | !bVar13 * uVar145) |
                 !bVar60 * auVar134._16_4_;
            bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar134._20_4_ =
                 (uint)bVar60 * ((uint)bVar14 * auVar100._20_4_ | !bVar14 * uVar146) |
                 !bVar60 * auVar134._20_4_;
            bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar134._24_4_ =
                 (uint)bVar60 * ((uint)bVar15 * auVar100._24_4_ | !bVar15 * uVar147) |
                 !bVar60 * auVar134._24_4_;
            bVar60 = SUB81(uVar61 >> 7,0);
            auVar134._28_4_ =
                 (uint)bVar60 * ((uint)bVar16 * auVar100._28_4_ | !bVar16 * uVar148) |
                 !bVar60 * auVar134._28_4_;
            bVar58 = (~bVar53 | bVar50) & bVar58;
          }
        }
        auVar100 = vmovdqa64_avx512vl(auVar85);
        auVar285 = ZEXT3264(auVar100);
        auVar100 = vmovdqa64_avx512vl(auVar86);
        auVar286 = ZEXT3264(auVar100);
        auVar257._0_4_ = local_800._0_4_ * auVar139._0_4_;
        auVar257._4_4_ = local_800._4_4_ * auVar139._4_4_;
        auVar257._8_4_ = local_800._8_4_ * auVar139._8_4_;
        auVar257._12_4_ = local_800._12_4_ * auVar139._12_4_;
        auVar257._16_4_ = local_800._16_4_ * auVar139._16_4_;
        auVar257._20_4_ = local_800._20_4_ * auVar139._20_4_;
        auVar257._28_36_ = auVar139._28_36_;
        auVar257._24_4_ = local_800._24_4_ * auVar139._24_4_;
        auVar279 = ZEXT3264(local_7e0);
        auVar83 = vfmadd231ps_fma(auVar257._0_32_,local_7e0,auVar97);
        auVar262 = ZEXT3264(local_7c0);
        auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),local_7c0,auVar115);
        auVar256._8_4_ = 0x7fffffff;
        auVar256._0_8_ = 0x7fffffff7fffffff;
        auVar256._12_4_ = 0x7fffffff;
        auVar256._16_4_ = 0x7fffffff;
        auVar256._20_4_ = 0x7fffffff;
        auVar256._24_4_ = 0x7fffffff;
        auVar256._28_4_ = 0x7fffffff;
        auVar257 = ZEXT3264(auVar256);
        auVar97 = vandps_avx(ZEXT1632(auVar83),auVar256);
        auVar274 = ZEXT3264(auVar96);
        _local_440 = auVar96;
        auVar252._8_4_ = 0x3e99999a;
        auVar252._0_8_ = 0x3e99999a3e99999a;
        auVar252._12_4_ = 0x3e99999a;
        auVar252._16_4_ = 0x3e99999a;
        auVar252._20_4_ = 0x3e99999a;
        auVar252._24_4_ = 0x3e99999a;
        auVar252._28_4_ = 0x3e99999a;
        uVar19 = vcmpps_avx512vl(auVar97,auVar252,1);
        _local_700 = vmaxps_avx(auVar96,auVar134);
        auVar97 = vminps_avx(local_660,auVar124);
        uVar21 = vcmpps_avx512vl(auVar96,auVar97,2);
        bVar53 = (byte)uVar21 & bVar49;
        uVar20 = vcmpps_avx512vl(_local_700,local_660,2);
        if ((bVar49 & ((byte)uVar20 | (byte)uVar21)) == 0) {
          auVar167 = ZEXT3264(auVar256);
        }
        else {
          bVar50 = (byte)uVar19 | ~bVar58;
          auVar43._4_4_ = local_800._4_4_ * auVar270._4_4_;
          auVar43._0_4_ = local_800._0_4_ * auVar270._0_4_;
          auVar43._8_4_ = local_800._8_4_ * auVar270._8_4_;
          auVar43._12_4_ = local_800._12_4_ * auVar270._12_4_;
          auVar43._16_4_ = local_800._16_4_ * auVar270._16_4_;
          auVar43._20_4_ = local_800._20_4_ * auVar270._20_4_;
          auVar43._24_4_ = local_800._24_4_ * auVar270._24_4_;
          auVar43._28_4_ = auVar97._28_4_;
          auVar83 = vfmadd213ps_fma(auVar116,local_7e0,auVar43);
          auVar83 = vfmadd213ps_fma(auVar99,local_7c0,ZEXT1632(auVar83));
          auVar99 = vandps_avx(ZEXT1632(auVar83),auVar256);
          uVar19 = vcmpps_avx512vl(auVar99,auVar252,1);
          bVar58 = (byte)uVar19 | ~bVar58;
          auVar161._8_4_ = 2;
          auVar161._0_8_ = 0x200000002;
          auVar161._12_4_ = 2;
          auVar161._16_4_ = 2;
          auVar161._20_4_ = 2;
          auVar161._24_4_ = 2;
          auVar161._28_4_ = 2;
          auVar31._8_4_ = 3;
          auVar31._0_8_ = 0x300000003;
          auVar31._12_4_ = 3;
          auVar31._16_4_ = 3;
          auVar31._20_4_ = 3;
          auVar31._24_4_ = 3;
          auVar31._28_4_ = 3;
          auVar99 = vpblendmd_avx512vl(auVar161,auVar31);
          local_640._0_4_ = (uint)(bVar58 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar58 & 1) * 2;
          bVar60 = (bool)(bVar58 >> 1 & 1);
          local_640._4_4_ = (uint)bVar60 * auVar99._4_4_ | (uint)!bVar60 * 2;
          bVar60 = (bool)(bVar58 >> 2 & 1);
          local_640._8_4_ = (uint)bVar60 * auVar99._8_4_ | (uint)!bVar60 * 2;
          bVar60 = (bool)(bVar58 >> 3 & 1);
          local_640._12_4_ = (uint)bVar60 * auVar99._12_4_ | (uint)!bVar60 * 2;
          bVar60 = (bool)(bVar58 >> 4 & 1);
          local_640._16_4_ = (uint)bVar60 * auVar99._16_4_ | (uint)!bVar60 * 2;
          bVar60 = (bool)(bVar58 >> 5 & 1);
          local_640._20_4_ = (uint)bVar60 * auVar99._20_4_ | (uint)!bVar60 * 2;
          bVar60 = (bool)(bVar58 >> 6 & 1);
          local_640._24_4_ = (uint)bVar60 * auVar99._24_4_ | (uint)!bVar60 * 2;
          local_640._28_4_ = (uint)(bVar58 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar58 >> 7) * 2;
          local_6a0 = vpbroadcastd_avx512vl();
          uVar19 = vpcmpd_avx512vl(local_6a0,local_640,5);
          local_6e0 = auVar96._0_4_ + (float)local_7a0._0_4_;
          fStack_6dc = auVar96._4_4_ + (float)local_7a0._4_4_;
          fStack_6d8 = auVar96._8_4_ + fStack_798;
          fStack_6d4 = auVar96._12_4_ + fStack_794;
          fStack_6d0 = auVar96._16_4_ + fStack_790;
          fStack_6cc = auVar96._20_4_ + fStack_78c;
          fStack_6c8 = auVar96._24_4_ + fStack_788;
          fStack_6c4 = auVar96._28_4_ + fStack_784;
          _local_680 = _local_700;
          for (bVar58 = (byte)uVar19 & bVar53; auVar99 = _local_680, bVar58 != 0;
              bVar58 = ~bVar56 & bVar58 & (byte)uVar19) {
            auVar162._8_4_ = 0x7f800000;
            auVar162._0_8_ = 0x7f8000007f800000;
            auVar162._12_4_ = 0x7f800000;
            auVar162._16_4_ = 0x7f800000;
            auVar162._20_4_ = 0x7f800000;
            auVar162._24_4_ = 0x7f800000;
            auVar162._28_4_ = 0x7f800000;
            auVar99 = vblendmps_avx512vl(auVar162,auVar96);
            auVar135._0_4_ =
                 (uint)(bVar58 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar58 & 1) * 0x7f800000;
            bVar60 = (bool)(bVar58 >> 1 & 1);
            auVar135._4_4_ = (uint)bVar60 * auVar99._4_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar58 >> 2 & 1);
            auVar135._8_4_ = (uint)bVar60 * auVar99._8_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar58 >> 3 & 1);
            auVar135._12_4_ = (uint)bVar60 * auVar99._12_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar58 >> 4 & 1);
            auVar135._16_4_ = (uint)bVar60 * auVar99._16_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar58 >> 5 & 1);
            auVar135._20_4_ = (uint)bVar60 * auVar99._20_4_ | (uint)!bVar60 * 0x7f800000;
            auVar135._24_4_ =
                 (uint)(bVar58 >> 6) * auVar99._24_4_ | (uint)!(bool)(bVar58 >> 6) * 0x7f800000;
            auVar135._28_4_ = 0x7f800000;
            auVar99 = vshufps_avx(auVar135,auVar135,0xb1);
            auVar99 = vminps_avx(auVar135,auVar99);
            auVar97 = vshufpd_avx(auVar99,auVar99,5);
            auVar99 = vminps_avx(auVar99,auVar97);
            auVar97 = vpermpd_avx2(auVar99,0x4e);
            auVar99 = vminps_avx(auVar99,auVar97);
            uVar19 = vcmpps_avx512vl(auVar135,auVar99,0);
            bVar51 = (byte)uVar19 & bVar58;
            bVar56 = bVar58;
            if (bVar51 != 0) {
              bVar56 = bVar51;
            }
            iVar22 = 0;
            for (uVar62 = (uint)bVar56; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            bVar56 = '\x01' << ((byte)iVar22 & 0x1f);
            uVar62 = *(uint *)(local_520 + (uint)(iVar22 << 2));
            uVar142 = *(uint *)(local_440 + (uint)(iVar22 << 2));
            fVar258 = auVar82._0_4_;
            if ((float)local_9e0._0_4_ < 0.0) {
              auVar262 = ZEXT1664(auVar262._0_16_);
              auVar270 = ZEXT1664(auVar270._0_16_);
              auVar274 = ZEXT1664(auVar274._0_16_);
              auVar279 = ZEXT1664(auVar279._0_16_);
              fVar258 = sqrtf((float)local_9e0._0_4_);
              auVar99 = vmovdqa64_avx512vl(auVar86);
              auVar286 = ZEXT3264(auVar99);
              auVar99 = vmovdqa64_avx512vl(auVar85);
              auVar285 = ZEXT3264(auVar99);
            }
            auVar257 = ZEXT464(uVar142);
            uVar61 = (ulong)bVar56;
            auVar79 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar83 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar2 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar3 = vminps_avx(auVar79,auVar2);
            auVar79 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar2 = vmaxps_avx(auVar83,auVar79);
            auVar221._8_4_ = 0x7fffffff;
            auVar221._0_8_ = 0x7fffffff7fffffff;
            auVar221._12_4_ = 0x7fffffff;
            auVar83 = vandps_avx(auVar3,auVar221);
            auVar79 = vandps_avx(auVar2,auVar221);
            auVar83 = vmaxps_avx(auVar83,auVar79);
            auVar79 = vmovshdup_avx(auVar83);
            auVar79 = vmaxss_avx(auVar79,auVar83);
            auVar83 = vshufpd_avx(auVar83,auVar83,1);
            auVar83 = vmaxss_avx(auVar83,auVar79);
            fVar263 = auVar83._0_4_ * 1.9073486e-06;
            local_900 = vshufps_avx(auVar2,auVar2,0xff);
            auVar83 = vinsertps_avx(ZEXT416(uVar142),ZEXT416(uVar62),0x10);
            auVar268 = ZEXT1664(auVar83);
            uVar57 = 0;
            while( true ) {
              bVar51 = (byte)uVar61;
              if (uVar57 == 5) break;
              uVar174 = auVar268._0_4_;
              auVar153._4_4_ = uVar174;
              auVar153._0_4_ = uVar174;
              auVar153._8_4_ = uVar174;
              auVar153._12_4_ = uVar174;
              auVar83 = vfmadd132ps_fma(auVar153,ZEXT816(0) << 0x40,local_9d0);
              auVar79 = vmovshdup_avx(auVar268._0_16_);
              fVar241 = auVar79._0_4_;
              fVar242 = 1.0 - fVar241;
              fVar265 = fVar242 * fVar242 * fVar242;
              fVar236 = fVar241 * fVar241 * fVar241;
              auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar265),
                                       ZEXT416((uint)fVar236));
              fVar264 = fVar241 * fVar242;
              auVar70 = ZEXT416((uint)fVar242);
              auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar264 * fVar241 * 6.0)),
                                        ZEXT416((uint)(fVar264 * fVar242)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar236),
                                       ZEXT416((uint)fVar265));
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(fVar264 * fVar242 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar264 * fVar241)));
              fVar265 = fVar265 * 0.16666667;
              fVar234 = (auVar2._0_4_ + auVar74._0_4_) * 0.16666667;
              fVar235 = (auVar3._0_4_ + auVar69._0_4_) * 0.16666667;
              fVar236 = fVar236 * 0.16666667;
              auVar196._0_4_ = fVar236 * (float)local_9c0._0_4_;
              auVar196._4_4_ = fVar236 * (float)local_9c0._4_4_;
              auVar196._8_4_ = fVar236 * fStack_9b8;
              auVar196._12_4_ = fVar236 * fStack_9b4;
              auVar238._4_4_ = fVar235;
              auVar238._0_4_ = fVar235;
              auVar238._8_4_ = fVar235;
              auVar238._12_4_ = fVar235;
              auVar2 = vfmadd132ps_fma(auVar238,auVar196,local_980._0_16_);
              auVar197._4_4_ = fVar234;
              auVar197._0_4_ = fVar234;
              auVar197._8_4_ = fVar234;
              auVar197._12_4_ = fVar234;
              auVar2 = vfmadd132ps_fma(auVar197,auVar2,local_9a0._0_16_);
              auVar178._4_4_ = fVar265;
              auVar178._0_4_ = fVar265;
              auVar178._8_4_ = fVar265;
              auVar178._12_4_ = fVar265;
              auVar2 = vfmadd132ps_fma(auVar178,auVar2,local_960._0_16_);
              local_820._0_16_ = auVar2;
              auVar2 = vsubps_avx(auVar83,auVar2);
              auVar83 = vdpps_avx(auVar2,auVar2,0x7f);
              local_a00._0_16_ = auVar83;
              local_780 = auVar268;
              if (auVar83._0_4_ < 0.0) {
                auVar262._0_4_ = sqrtf(auVar83._0_4_);
                auVar262._4_60_ = extraout_var;
                auVar83 = auVar262._0_16_;
                uVar61 = extraout_RAX;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
              }
              local_840._4_4_ = fVar242;
              local_840._0_4_ = fVar242;
              fStack_838 = fVar242;
              fStack_834 = fVar242;
              auVar74 = vfnmsub213ss_fma(auVar79,auVar79,ZEXT416((uint)(fVar264 * 4.0)));
              auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar264 * 4.0)),auVar70,auVar70);
              fVar264 = fVar242 * -fVar242 * 0.5;
              fVar265 = auVar74._0_4_ * 0.5;
              fVar234 = auVar3._0_4_ * 0.5;
              fVar235 = fVar241 * fVar241 * 0.5;
              auVar222._0_4_ = fVar235 * (float)local_9c0._0_4_;
              auVar222._4_4_ = fVar235 * (float)local_9c0._4_4_;
              auVar222._8_4_ = fVar235 * fStack_9b8;
              auVar222._12_4_ = fVar235 * fStack_9b4;
              auVar179._4_4_ = fVar234;
              auVar179._0_4_ = fVar234;
              auVar179._8_4_ = fVar234;
              auVar179._12_4_ = fVar234;
              auVar3 = vfmadd132ps_fma(auVar179,auVar222,local_980._0_16_);
              auVar198._4_4_ = fVar265;
              auVar198._0_4_ = fVar265;
              auVar198._8_4_ = fVar265;
              auVar198._12_4_ = fVar265;
              auVar3 = vfmadd132ps_fma(auVar198,auVar3,local_9a0._0_16_);
              auVar276._4_4_ = fVar264;
              auVar276._0_4_ = fVar264;
              auVar276._8_4_ = fVar264;
              auVar276._12_4_ = fVar264;
              auVar3 = vfmadd132ps_fma(auVar276,auVar3,local_960._0_16_);
              local_860._0_16_ = vdpps_avx(auVar3,auVar3,0x7f);
              auVar44._12_4_ = 0;
              auVar44._0_12_ = ZEXT812(0);
              fVar264 = local_860._0_4_;
              local_940._0_16_ = vrsqrt14ss_avx512f(auVar44 << 0x20,ZEXT416((uint)fVar264));
              fVar265 = local_940._0_4_;
              local_880._0_16_ = vrcp14ss_avx512f(auVar44 << 0x20,ZEXT416((uint)fVar264));
              auVar74 = vfnmadd213ss_fma(local_880._0_16_,local_860._0_16_,ZEXT416(0x40000000));
              local_8a0._0_4_ = auVar74._0_4_;
              uVar62 = auVar83._0_4_;
              if (fVar264 < -fVar264) {
                fVar234 = sqrtf(fVar264);
                auVar83 = ZEXT416(uVar62);
                uVar61 = extraout_RAX_00;
              }
              else {
                auVar74 = vsqrtss_avx(local_860._0_16_,local_860._0_16_);
                fVar234 = auVar74._0_4_;
              }
              fVar235 = local_940._0_4_;
              fVar264 = fVar265 * 1.5 + fVar264 * -0.5 * fVar235 * fVar235 * fVar235;
              local_940._0_4_ = auVar3._0_4_ * fVar264;
              local_940._4_4_ = auVar3._4_4_ * fVar264;
              local_940._8_4_ = auVar3._8_4_ * fVar264;
              local_940._12_4_ = auVar3._12_4_ * fVar264;
              auVar74 = vdpps_avx(auVar2,local_940._0_16_,0x7f);
              fVar236 = auVar83._0_4_;
              fVar265 = auVar74._0_4_;
              auVar154._0_4_ = fVar265 * fVar265;
              auVar154._4_4_ = auVar74._4_4_ * auVar74._4_4_;
              auVar154._8_4_ = auVar74._8_4_ * auVar74._8_4_;
              auVar154._12_4_ = auVar74._12_4_ * auVar74._12_4_;
              auVar69 = vsubps_avx(local_a00._0_16_,auVar154);
              fVar235 = auVar69._0_4_;
              auVar180._4_12_ = ZEXT812(0) << 0x20;
              auVar180._0_4_ = fVar235;
              auVar71 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar180);
              auVar72 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
              auVar73 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
              if (fVar235 < 0.0) {
                local_8c0._0_4_ = fVar234;
                local_8e0._0_4_ = auVar72._0_4_;
                local_8f0._4_4_ = fVar264;
                local_8f0._0_4_ = fVar264;
                fStack_8e8 = fVar264;
                fStack_8e4 = fVar264;
                local_8d0 = auVar71;
                fVar235 = sqrtf(fVar235);
                auVar73 = ZEXT416(auVar73._0_4_);
                auVar72 = ZEXT416((uint)local_8e0._0_4_);
                auVar83 = ZEXT416(uVar62);
                uVar61 = extraout_RAX_01;
                auVar71 = local_8d0;
                fVar264 = (float)local_8f0._0_4_;
                fVar242 = (float)local_8f0._4_4_;
                fVar241 = fStack_8e8;
                fVar284 = fStack_8e4;
                fVar234 = (float)local_8c0._0_4_;
              }
              else {
                auVar69 = vsqrtss_avx(auVar69,auVar69);
                fVar235 = auVar69._0_4_;
                fVar242 = fVar264;
                fVar241 = fVar264;
                fVar284 = fVar264;
              }
              auVar279 = ZEXT1664(auVar3);
              auVar274 = ZEXT1664(local_a00._0_16_);
              auVar270 = ZEXT1664(auVar2);
              auVar99 = vmovdqa64_avx512vl(auVar85);
              auVar285 = ZEXT3264(auVar99);
              auVar99 = vmovdqa64_avx512vl(auVar86);
              auVar286 = ZEXT3264(auVar99);
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar70,auVar79);
              auVar70 = vfmadd213ss_fma(auVar79,SUB6416(ZEXT464(0xc0000000),0),auVar70);
              auVar77 = local_780._0_16_;
              auVar79 = vshufps_avx(auVar77,auVar77,0x55);
              auVar199._0_4_ = auVar79._0_4_ * (float)local_9c0._0_4_;
              auVar199._4_4_ = auVar79._4_4_ * (float)local_9c0._4_4_;
              auVar199._8_4_ = auVar79._8_4_ * fStack_9b8;
              auVar199._12_4_ = auVar79._12_4_ * fStack_9b4;
              auVar223._0_4_ = auVar70._0_4_;
              auVar223._4_4_ = auVar223._0_4_;
              auVar223._8_4_ = auVar223._0_4_;
              auVar223._12_4_ = auVar223._0_4_;
              auVar79 = vfmadd132ps_fma(auVar223,auVar199,local_980._0_16_);
              auVar181._0_4_ = auVar69._0_4_;
              auVar181._4_4_ = auVar181._0_4_;
              auVar181._8_4_ = auVar181._0_4_;
              auVar181._12_4_ = auVar181._0_4_;
              auVar79 = vfmadd132ps_fma(auVar181,auVar79,local_9a0._0_16_);
              auVar79 = vfmadd132ps_fma(_local_840,auVar79,local_960._0_16_);
              auVar182._0_4_ = auVar79._0_4_ * (float)local_860._0_4_;
              auVar182._4_4_ = auVar79._4_4_ * (float)local_860._0_4_;
              auVar182._8_4_ = auVar79._8_4_ * (float)local_860._0_4_;
              auVar182._12_4_ = auVar79._12_4_ * (float)local_860._0_4_;
              auVar79 = vdpps_avx(auVar3,auVar79,0x7f);
              fVar194 = auVar79._0_4_;
              auVar200._0_4_ = auVar3._0_4_ * fVar194;
              auVar200._4_4_ = auVar3._4_4_ * fVar194;
              auVar200._8_4_ = auVar3._8_4_ * fVar194;
              auVar200._12_4_ = auVar3._12_4_ * fVar194;
              auVar79 = vsubps_avx(auVar182,auVar200);
              fVar194 = (float)local_8a0._0_4_ * (float)local_880._0_4_;
              auVar70 = vmaxss_avx(ZEXT416((uint)fVar263),
                                   ZEXT416((uint)(local_780._0_4_ * fVar258 * 1.9073486e-06)));
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar76 = vxorps_avx512vl(auVar3,auVar23);
              auVar201._0_4_ = fVar264 * auVar79._0_4_ * fVar194;
              auVar201._4_4_ = fVar242 * auVar79._4_4_ * fVar194;
              auVar201._8_4_ = fVar241 * auVar79._8_4_ * fVar194;
              auVar201._12_4_ = fVar284 * auVar79._12_4_ * fVar194;
              auVar79 = vdpps_avx(auVar76,local_940._0_16_,0x7f);
              auVar69 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar263),auVar70);
              auVar83 = vdpps_avx(auVar2,auVar201,0x7f);
              auVar75 = vfmadd213ss_fma(ZEXT416((uint)(fVar236 + 1.0)),
                                        ZEXT416((uint)(fVar263 / fVar234)),auVar69);
              fVar264 = auVar79._0_4_ + auVar83._0_4_;
              auVar83 = vdpps_avx(local_9d0,local_940._0_16_,0x7f);
              auVar79 = vdpps_avx(auVar2,auVar76,0x7f);
              auVar69 = vmulss_avx512f(auVar73,auVar71);
              auVar73 = vaddss_avx512f(auVar72,ZEXT416((uint)(auVar69._0_4_ *
                                                             auVar71._0_4_ * auVar71._0_4_)));
              auVar69 = vdpps_avx(auVar2,local_9d0,0x7f);
              auVar72 = vfnmadd231ss_fma(auVar79,auVar74,ZEXT416((uint)fVar264));
              auVar69 = vfnmadd231ss_fma(auVar69,auVar74,auVar83);
              auVar79 = vpermilps_avx(local_820._0_16_,0xff);
              fVar235 = fVar235 - auVar79._0_4_;
              auVar71 = vshufps_avx(auVar3,auVar3,0xff);
              auVar79 = vfmsub213ss_fma(auVar72,auVar73,auVar71);
              auVar259._8_4_ = 0x80000000;
              auVar259._0_8_ = 0x8000000080000000;
              auVar259._12_4_ = 0x80000000;
              auVar262 = ZEXT1664(auVar259);
              auVar254._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
              auVar254._8_4_ = auVar79._8_4_ ^ 0x80000000;
              auVar254._12_4_ = auVar79._12_4_ ^ 0x80000000;
              auVar257 = ZEXT1664(auVar254);
              auVar69 = ZEXT416((uint)(auVar69._0_4_ * auVar73._0_4_));
              auVar72 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar79._0_4_)),
                                        ZEXT416((uint)fVar264),auVar69);
              auVar79 = vinsertps_avx(auVar254,auVar69,0x1c);
              auVar245._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
              auVar245._8_4_ = auVar83._8_4_ ^ 0x80000000;
              auVar245._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar69 = vinsertps_avx(ZEXT416((uint)fVar264),auVar245,0x10);
              auVar224._0_4_ = auVar72._0_4_;
              auVar224._4_4_ = auVar224._0_4_;
              auVar224._8_4_ = auVar224._0_4_;
              auVar224._12_4_ = auVar224._0_4_;
              auVar83 = vdivps_avx(auVar79,auVar224);
              auVar79 = vdivps_avx(auVar69,auVar224);
              auVar225._0_4_ = fVar265 * auVar83._0_4_ + fVar235 * auVar79._0_4_;
              auVar225._4_4_ = fVar265 * auVar83._4_4_ + fVar235 * auVar79._4_4_;
              auVar225._8_4_ = fVar265 * auVar83._8_4_ + fVar235 * auVar79._8_4_;
              auVar225._12_4_ = fVar265 * auVar83._12_4_ + fVar235 * auVar79._12_4_;
              auVar83 = vsubps_avx(auVar77,auVar225);
              auVar268 = ZEXT1664(auVar83);
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(auVar74,auVar24);
              if (auVar79._0_4_ < auVar75._0_4_) {
                auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ + auVar70._0_4_)),local_900,
                                          ZEXT416(0x36000000));
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar74 = vandps_avx512vl(ZEXT416((uint)fVar235),auVar25);
                if (auVar74._0_4_ < auVar79._0_4_) {
                  bVar60 = uVar57 < 5;
                  fVar258 = auVar83._0_4_ + (float)local_910._0_4_;
                  if ((fVar17 <= fVar258) &&
                     (fVar263 = *(float *)(ray + k * 4 + 0x200), fVar258 <= fVar263)) {
                    auVar79 = vmovshdup_avx(auVar83);
                    bVar51 = 0;
                    if ((auVar79._0_4_ < 0.0) || (1.0 < auVar79._0_4_)) goto LAB_018df587;
                    auVar226._0_12_ = ZEXT812(0);
                    auVar226._12_4_ = 0;
                    auVar202._4_8_ = auVar226._4_8_;
                    auVar202._0_4_ = local_a00._0_4_;
                    auVar202._12_4_ = 0;
                    auVar79 = vrsqrt14ss_avx512f(auVar226,auVar202);
                    fVar264 = auVar79._0_4_;
                    pGVar5 = (context->scene->geometries).items[uVar4].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar51 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_018df587;
                      fVar264 = fVar264 * 1.5 + local_a00._0_4_ * -0.5 * fVar264 * fVar264 * fVar264
                      ;
                      auVar203._0_4_ = auVar2._0_4_ * fVar264;
                      auVar203._4_4_ = auVar2._4_4_ * fVar264;
                      auVar203._8_4_ = auVar2._8_4_ * fVar264;
                      auVar203._12_4_ = auVar2._12_4_ * fVar264;
                      auVar70 = vfmadd213ps_fma(auVar71,auVar203,auVar3);
                      auVar79 = vshufps_avx(auVar203,auVar203,0xc9);
                      auVar74 = vshufps_avx(auVar3,auVar3,0xc9);
                      auVar204._0_4_ = auVar203._0_4_ * auVar74._0_4_;
                      auVar204._4_4_ = auVar203._4_4_ * auVar74._4_4_;
                      auVar204._8_4_ = auVar203._8_4_ * auVar74._8_4_;
                      auVar204._12_4_ = auVar203._12_4_ * auVar74._12_4_;
                      auVar69 = vfmsub231ps_fma(auVar204,auVar3,auVar79);
                      auVar79 = vshufps_avx(auVar69,auVar69,0xc9);
                      auVar74 = vshufps_avx(auVar70,auVar70,0xc9);
                      auVar69 = vshufps_avx(auVar69,auVar69,0xd2);
                      auVar155._0_4_ = auVar70._0_4_ * auVar69._0_4_;
                      auVar155._4_4_ = auVar70._4_4_ * auVar69._4_4_;
                      auVar155._8_4_ = auVar70._8_4_ * auVar69._8_4_;
                      auVar155._12_4_ = auVar70._12_4_ * auVar69._12_4_;
                      auVar79 = vfmsub231ps_fma(auVar155,auVar79,auVar74);
                      auVar167 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar167,auVar268);
                      auVar167 = vpermps_avx512f(auVar167,ZEXT1664(auVar79));
                      auVar139 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar139,ZEXT1664(auVar79));
                      local_380 = vbroadcastss_avx512f(auVar79);
                      local_400[0] = (RTCHitN)auVar167[0];
                      local_400[1] = (RTCHitN)auVar167[1];
                      local_400[2] = (RTCHitN)auVar167[2];
                      local_400[3] = (RTCHitN)auVar167[3];
                      local_400[4] = (RTCHitN)auVar167[4];
                      local_400[5] = (RTCHitN)auVar167[5];
                      local_400[6] = (RTCHitN)auVar167[6];
                      local_400[7] = (RTCHitN)auVar167[7];
                      local_400[8] = (RTCHitN)auVar167[8];
                      local_400[9] = (RTCHitN)auVar167[9];
                      local_400[10] = (RTCHitN)auVar167[10];
                      local_400[0xb] = (RTCHitN)auVar167[0xb];
                      local_400[0xc] = (RTCHitN)auVar167[0xc];
                      local_400[0xd] = (RTCHitN)auVar167[0xd];
                      local_400[0xe] = (RTCHitN)auVar167[0xe];
                      local_400[0xf] = (RTCHitN)auVar167[0xf];
                      local_400[0x10] = (RTCHitN)auVar167[0x10];
                      local_400[0x11] = (RTCHitN)auVar167[0x11];
                      local_400[0x12] = (RTCHitN)auVar167[0x12];
                      local_400[0x13] = (RTCHitN)auVar167[0x13];
                      local_400[0x14] = (RTCHitN)auVar167[0x14];
                      local_400[0x15] = (RTCHitN)auVar167[0x15];
                      local_400[0x16] = (RTCHitN)auVar167[0x16];
                      local_400[0x17] = (RTCHitN)auVar167[0x17];
                      local_400[0x18] = (RTCHitN)auVar167[0x18];
                      local_400[0x19] = (RTCHitN)auVar167[0x19];
                      local_400[0x1a] = (RTCHitN)auVar167[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar167[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar167[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar167[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar167[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar167[0x1f];
                      local_400[0x20] = (RTCHitN)auVar167[0x20];
                      local_400[0x21] = (RTCHitN)auVar167[0x21];
                      local_400[0x22] = (RTCHitN)auVar167[0x22];
                      local_400[0x23] = (RTCHitN)auVar167[0x23];
                      local_400[0x24] = (RTCHitN)auVar167[0x24];
                      local_400[0x25] = (RTCHitN)auVar167[0x25];
                      local_400[0x26] = (RTCHitN)auVar167[0x26];
                      local_400[0x27] = (RTCHitN)auVar167[0x27];
                      local_400[0x28] = (RTCHitN)auVar167[0x28];
                      local_400[0x29] = (RTCHitN)auVar167[0x29];
                      local_400[0x2a] = (RTCHitN)auVar167[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar167[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar167[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar167[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar167[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar167[0x2f];
                      local_400[0x30] = (RTCHitN)auVar167[0x30];
                      local_400[0x31] = (RTCHitN)auVar167[0x31];
                      local_400[0x32] = (RTCHitN)auVar167[0x32];
                      local_400[0x33] = (RTCHitN)auVar167[0x33];
                      local_400[0x34] = (RTCHitN)auVar167[0x34];
                      local_400[0x35] = (RTCHitN)auVar167[0x35];
                      local_400[0x36] = (RTCHitN)auVar167[0x36];
                      local_400[0x37] = (RTCHitN)auVar167[0x37];
                      local_400[0x38] = (RTCHitN)auVar167[0x38];
                      local_400[0x39] = (RTCHitN)auVar167[0x39];
                      local_400[0x3a] = (RTCHitN)auVar167[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar167[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar167[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar167[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar167[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar167[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar167 = vmovdqa64_avx512f(local_4c0);
                      local_280 = vmovdqa64_avx512f(auVar167);
                      vpcmpeqd_avx2(auVar167._0_32_,auVar167._0_32_);
                      local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar258;
                      auVar167 = vmovdqa64_avx512f(local_500);
                      local_740 = vmovdqa64_avx512f(auVar167);
                      local_a30.valid = (int *)local_740;
                      local_a30.geometryUserPtr = pGVar5->userPtr;
                      local_a30.context = context->user;
                      local_a30.hit = local_400;
                      local_a30.N = 0x10;
                      local_a30.ray = (RTCRayN *)ray;
                      if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar257 = ZEXT1664(auVar254);
                        auVar262 = ZEXT1664(auVar259);
                        auVar268 = ZEXT1664(auVar83);
                        auVar270 = ZEXT1664(auVar2);
                        auVar274 = ZEXT1664(local_a00._0_16_);
                        auVar279 = ZEXT1664(auVar3);
                        (*pGVar5->occlusionFilterN)(&local_a30);
                        auVar99 = vmovdqa64_avx512vl(auVar86);
                        auVar286 = ZEXT3264(auVar99);
                        auVar99 = vmovdqa64_avx512vl(auVar85);
                        auVar285 = ZEXT3264(auVar99);
                        auVar167 = vmovdqa64_avx512f(local_740);
                      }
                      uVar19 = vptestmd_avx512f(auVar167,auVar167);
                      if ((short)uVar19 != 0) {
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar257 = ZEXT1664(auVar257._0_16_);
                          auVar262 = ZEXT1664(auVar262._0_16_);
                          auVar268 = ZEXT1664(auVar268._0_16_);
                          auVar270 = ZEXT1664(auVar270._0_16_);
                          auVar274 = ZEXT1664(auVar274._0_16_);
                          auVar279 = ZEXT1664(auVar279._0_16_);
                          (*p_Var9)(&local_a30);
                          auVar99 = vmovdqa64_avx512vl(auVar86);
                          auVar286 = ZEXT3264(auVar99);
                          auVar99 = vmovdqa64_avx512vl(auVar85);
                          auVar285 = ZEXT3264(auVar99);
                          auVar167 = vmovdqa64_avx512f(local_740);
                        }
                        uVar61 = vptestmd_avx512f(auVar167,auVar167);
                        auVar167 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar10 = (bool)((byte)uVar61 & 1);
                        auVar140._0_4_ =
                             (uint)bVar10 * auVar167._0_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x200);
                        bVar10 = (bool)((byte)(uVar61 >> 1) & 1);
                        auVar140._4_4_ =
                             (uint)bVar10 * auVar167._4_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x204);
                        bVar10 = (bool)((byte)(uVar61 >> 2) & 1);
                        auVar140._8_4_ =
                             (uint)bVar10 * auVar167._8_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x208);
                        bVar10 = (bool)((byte)(uVar61 >> 3) & 1);
                        auVar140._12_4_ =
                             (uint)bVar10 * auVar167._12_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x20c);
                        bVar10 = (bool)((byte)(uVar61 >> 4) & 1);
                        auVar140._16_4_ =
                             (uint)bVar10 * auVar167._16_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x210);
                        bVar10 = (bool)((byte)(uVar61 >> 5) & 1);
                        auVar140._20_4_ =
                             (uint)bVar10 * auVar167._20_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x214);
                        bVar10 = (bool)((byte)(uVar61 >> 6) & 1);
                        auVar140._24_4_ =
                             (uint)bVar10 * auVar167._24_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x218);
                        bVar10 = (bool)((byte)(uVar61 >> 7) & 1);
                        auVar140._28_4_ =
                             (uint)bVar10 * auVar167._28_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x21c);
                        bVar10 = (bool)((byte)(uVar61 >> 8) & 1);
                        auVar140._32_4_ =
                             (uint)bVar10 * auVar167._32_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x220);
                        bVar10 = (bool)((byte)(uVar61 >> 9) & 1);
                        auVar140._36_4_ =
                             (uint)bVar10 * auVar167._36_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x224);
                        bVar10 = (bool)((byte)(uVar61 >> 10) & 1);
                        auVar140._40_4_ =
                             (uint)bVar10 * auVar167._40_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x228);
                        bVar10 = (bool)((byte)(uVar61 >> 0xb) & 1);
                        auVar140._44_4_ =
                             (uint)bVar10 * auVar167._44_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x22c);
                        bVar10 = (bool)((byte)(uVar61 >> 0xc) & 1);
                        auVar140._48_4_ =
                             (uint)bVar10 * auVar167._48_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x230);
                        bVar10 = (bool)((byte)(uVar61 >> 0xd) & 1);
                        auVar140._52_4_ =
                             (uint)bVar10 * auVar167._52_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x234);
                        bVar10 = (bool)((byte)(uVar61 >> 0xe) & 1);
                        auVar140._56_4_ =
                             (uint)bVar10 * auVar167._56_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x238);
                        bVar10 = SUB81(uVar61 >> 0xf,0);
                        auVar140._60_4_ =
                             (uint)bVar10 * auVar167._60_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x23c);
                        *(undefined1 (*) [64])(local_a30.ray + 0x200) = auVar140;
                        bVar51 = 1;
                        if ((short)uVar61 != 0) goto LAB_018df587;
                      }
                      *(float *)(ray + k * 4 + 0x200) = fVar263;
                      bVar51 = 0;
                      goto LAB_018df587;
                    }
                  }
                  bVar51 = 0;
                  goto LAB_018df587;
                }
              }
              uVar57 = uVar57 + 1;
            }
            bVar60 = false;
LAB_018df587:
            bVar52 = bVar52 | bVar60 & bVar51;
            uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar247._4_4_ = uVar174;
            auVar247._0_4_ = uVar174;
            auVar247._8_4_ = uVar174;
            auVar247._12_4_ = uVar174;
            auVar247._16_4_ = uVar174;
            auVar247._20_4_ = uVar174;
            auVar247._24_4_ = uVar174;
            auVar247._28_4_ = uVar174;
            auVar167 = ZEXT3264(auVar247);
            auVar46._4_4_ = fStack_6dc;
            auVar46._0_4_ = local_6e0;
            auVar46._8_4_ = fStack_6d8;
            auVar46._12_4_ = fStack_6d4;
            auVar46._16_4_ = fStack_6d0;
            auVar46._20_4_ = fStack_6cc;
            auVar46._24_4_ = fStack_6c8;
            auVar46._28_4_ = fStack_6c4;
            uVar19 = vcmpps_avx512vl(auVar247,auVar46,0xd);
          }
          auVar163._0_4_ = (float)local_7a0._0_4_ + (float)local_700._0_4_;
          auVar163._4_4_ = (float)local_7a0._4_4_ + (float)local_700._4_4_;
          auVar163._8_4_ = fStack_798 + fStack_6f8;
          auVar163._12_4_ = fStack_794 + fStack_6f4;
          auVar163._16_4_ = fStack_790 + fStack_6f0;
          auVar163._20_4_ = fStack_78c + fStack_6ec;
          auVar163._24_4_ = fStack_788 + fStack_6e8;
          auVar163._28_4_ = fStack_784 + fStack_6e4;
          uVar174 = auVar167._0_4_;
          auVar189._4_4_ = uVar174;
          auVar189._0_4_ = uVar174;
          auVar189._8_4_ = uVar174;
          auVar189._12_4_ = uVar174;
          auVar189._16_4_ = uVar174;
          auVar189._20_4_ = uVar174;
          auVar189._24_4_ = uVar174;
          auVar189._28_4_ = uVar174;
          uVar19 = vcmpps_avx512vl(auVar163,auVar189,2);
          auVar164._8_4_ = 2;
          auVar164._0_8_ = 0x200000002;
          auVar164._12_4_ = 2;
          auVar164._16_4_ = 2;
          auVar164._20_4_ = 2;
          auVar164._24_4_ = 2;
          auVar164._28_4_ = 2;
          auVar32._8_4_ = 3;
          auVar32._0_8_ = 0x300000003;
          auVar32._12_4_ = 3;
          auVar32._16_4_ = 3;
          auVar32._20_4_ = 3;
          auVar32._24_4_ = 3;
          auVar32._28_4_ = 3;
          auVar96 = vpblendmd_avx512vl(auVar164,auVar32);
          local_700._0_4_ = (uint)(bVar50 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar50 & 1) * 2;
          bVar60 = (bool)(bVar50 >> 1 & 1);
          local_700._4_4_ = (uint)bVar60 * auVar96._4_4_ | (uint)!bVar60 * 2;
          bVar60 = (bool)(bVar50 >> 2 & 1);
          fStack_6f8 = (float)((uint)bVar60 * auVar96._8_4_ | (uint)!bVar60 * 2);
          bVar60 = (bool)(bVar50 >> 3 & 1);
          fStack_6f4 = (float)((uint)bVar60 * auVar96._12_4_ | (uint)!bVar60 * 2);
          bVar60 = (bool)(bVar50 >> 4 & 1);
          fStack_6f0 = (float)((uint)bVar60 * auVar96._16_4_ | (uint)!bVar60 * 2);
          bVar60 = (bool)(bVar50 >> 5 & 1);
          fStack_6ec = (float)((uint)bVar60 * auVar96._20_4_ | (uint)!bVar60 * 2);
          bVar60 = (bool)(bVar50 >> 6 & 1);
          fStack_6e8 = (float)((uint)bVar60 * auVar96._24_4_ | (uint)!bVar60 * 2);
          fStack_6e4 = (float)((uint)(bVar50 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar50 >> 7) * 2
                              );
          bVar49 = (byte)uVar20 & bVar49 & (byte)uVar19;
          uVar19 = vpcmpd_avx512vl(_local_700,local_6a0,2);
          local_6e0 = (float)local_7a0._0_4_ + (float)local_680._0_4_;
          fStack_6dc = (float)local_7a0._4_4_ + (float)local_680._4_4_;
          fStack_6d8 = fStack_798 + fStack_678;
          fStack_6d4 = fStack_794 + fStack_674;
          fStack_6d0 = fStack_790 + fStack_670;
          fStack_6cc = fStack_78c + fStack_66c;
          fStack_6c8 = fStack_788 + fStack_668;
          fStack_6c4 = fStack_784 + fStack_664;
          for (bVar58 = (byte)uVar19 & bVar49; bVar58 != 0; bVar58 = ~bVar50 & bVar58 & (byte)uVar19
              ) {
            auVar165._8_4_ = 0x7f800000;
            auVar165._0_8_ = 0x7f8000007f800000;
            auVar165._12_4_ = 0x7f800000;
            auVar165._16_4_ = 0x7f800000;
            auVar165._20_4_ = 0x7f800000;
            auVar165._24_4_ = 0x7f800000;
            auVar165._28_4_ = 0x7f800000;
            auVar96 = vblendmps_avx512vl(auVar165,auVar99);
            auVar136._0_4_ =
                 (uint)(bVar58 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar58 & 1) * 0x7f800000;
            bVar60 = (bool)(bVar58 >> 1 & 1);
            auVar136._4_4_ = (uint)bVar60 * auVar96._4_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar58 >> 2 & 1);
            auVar136._8_4_ = (uint)bVar60 * auVar96._8_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar58 >> 3 & 1);
            auVar136._12_4_ = (uint)bVar60 * auVar96._12_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar58 >> 4 & 1);
            auVar136._16_4_ = (uint)bVar60 * auVar96._16_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar58 >> 5 & 1);
            auVar136._20_4_ = (uint)bVar60 * auVar96._20_4_ | (uint)!bVar60 * 0x7f800000;
            auVar136._24_4_ =
                 (uint)(bVar58 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar58 >> 6) * 0x7f800000;
            auVar136._28_4_ = 0x7f800000;
            auVar96 = vshufps_avx(auVar136,auVar136,0xb1);
            auVar96 = vminps_avx(auVar136,auVar96);
            auVar97 = vshufpd_avx(auVar96,auVar96,5);
            auVar96 = vminps_avx(auVar96,auVar97);
            auVar97 = vpermpd_avx2(auVar96,0x4e);
            auVar96 = vminps_avx(auVar96,auVar97);
            uVar19 = vcmpps_avx512vl(auVar136,auVar96,0);
            bVar56 = (byte)uVar19 & bVar58;
            bVar50 = bVar58;
            if (bVar56 != 0) {
              bVar50 = bVar56;
            }
            iVar22 = 0;
            for (uVar62 = (uint)bVar50; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            bVar50 = '\x01' << ((byte)iVar22 & 0x1f);
            uVar62 = *(uint *)(local_540 + (uint)(iVar22 << 2));
            uVar142 = *(uint *)(local_660 + (uint)(iVar22 << 2));
            fVar258 = auVar78._0_4_;
            if ((float)local_9e0._0_4_ < 0.0) {
              auVar262 = ZEXT1664(auVar262._0_16_);
              auVar270 = ZEXT1664(auVar270._0_16_);
              auVar274 = ZEXT1664(auVar274._0_16_);
              auVar279 = ZEXT1664(auVar279._0_16_);
              fVar258 = sqrtf((float)local_9e0._0_4_);
              auVar96 = vmovdqa64_avx512vl(auVar86);
              auVar286 = ZEXT3264(auVar96);
              auVar96 = vmovdqa64_avx512vl(auVar85);
              auVar285 = ZEXT3264(auVar96);
            }
            auVar257 = ZEXT464(uVar142);
            uVar61 = (ulong)bVar50;
            auVar79 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar83 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar2 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar3 = vminps_avx(auVar79,auVar2);
            auVar79 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar2 = vmaxps_avx(auVar83,auVar79);
            auVar227._8_4_ = 0x7fffffff;
            auVar227._0_8_ = 0x7fffffff7fffffff;
            auVar227._12_4_ = 0x7fffffff;
            auVar83 = vandps_avx(auVar3,auVar227);
            auVar79 = vandps_avx(auVar2,auVar227);
            auVar83 = vmaxps_avx(auVar83,auVar79);
            auVar79 = vmovshdup_avx(auVar83);
            auVar79 = vmaxss_avx(auVar79,auVar83);
            auVar83 = vshufpd_avx(auVar83,auVar83,1);
            auVar83 = vmaxss_avx(auVar83,auVar79);
            local_940._0_4_ = auVar83._0_4_ * 1.9073486e-06;
            local_900 = vshufps_avx(auVar2,auVar2,0xff);
            auVar83 = vinsertps_avx(ZEXT416(uVar142),ZEXT416(uVar62),0x10);
            auVar268 = ZEXT1664(auVar83);
            uVar57 = 0;
            while( true ) {
              bVar56 = (byte)uVar61;
              if (uVar57 == 5) break;
              uVar174 = auVar268._0_4_;
              auVar156._4_4_ = uVar174;
              auVar156._0_4_ = uVar174;
              auVar156._8_4_ = uVar174;
              auVar156._12_4_ = uVar174;
              auVar83 = vfmadd132ps_fma(auVar156,ZEXT816(0) << 0x40,local_9d0);
              auVar79 = vmovshdup_avx(auVar268._0_16_);
              fVar242 = auVar79._0_4_;
              fVar236 = 1.0 - fVar242;
              fVar264 = fVar236 * fVar236 * fVar236;
              fVar235 = fVar242 * fVar242 * fVar242;
              auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar264),
                                       ZEXT416((uint)fVar235));
              fVar263 = fVar242 * fVar236;
              auVar70 = ZEXT416((uint)fVar236);
              auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar263 * fVar242 * 6.0)),
                                        ZEXT416((uint)(fVar263 * fVar236)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar235),
                                       ZEXT416((uint)fVar264));
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(fVar263 * fVar236 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar263 * fVar242)));
              fVar264 = fVar264 * 0.16666667;
              fVar265 = (auVar2._0_4_ + auVar74._0_4_) * 0.16666667;
              fVar234 = (auVar3._0_4_ + auVar69._0_4_) * 0.16666667;
              fVar235 = fVar235 * 0.16666667;
              auVar205._0_4_ = fVar235 * (float)local_9c0._0_4_;
              auVar205._4_4_ = fVar235 * (float)local_9c0._4_4_;
              auVar205._8_4_ = fVar235 * fStack_9b8;
              auVar205._12_4_ = fVar235 * fStack_9b4;
              auVar239._4_4_ = fVar234;
              auVar239._0_4_ = fVar234;
              auVar239._8_4_ = fVar234;
              auVar239._12_4_ = fVar234;
              auVar2 = vfmadd132ps_fma(auVar239,auVar205,local_980._0_16_);
              auVar206._4_4_ = fVar265;
              auVar206._0_4_ = fVar265;
              auVar206._8_4_ = fVar265;
              auVar206._12_4_ = fVar265;
              auVar2 = vfmadd132ps_fma(auVar206,auVar2,local_9a0._0_16_);
              auVar183._4_4_ = fVar264;
              auVar183._0_4_ = fVar264;
              auVar183._8_4_ = fVar264;
              auVar183._12_4_ = fVar264;
              auVar2 = vfmadd132ps_fma(auVar183,auVar2,local_960._0_16_);
              local_820._0_16_ = auVar2;
              auVar2 = vsubps_avx(auVar83,auVar2);
              auVar83 = vdpps_avx(auVar2,auVar2,0x7f);
              local_a00._0_16_ = auVar83;
              local_780 = auVar268;
              if (auVar83._0_4_ < 0.0) {
                auVar167._0_4_ = sqrtf(auVar83._0_4_);
                auVar167._4_60_ = extraout_var_00;
                auVar83 = auVar167._0_16_;
                uVar61 = extraout_RAX_02;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
              }
              local_840._4_4_ = fVar236;
              local_840._0_4_ = fVar236;
              fStack_838 = fVar236;
              fStack_834 = fVar236;
              auVar74 = vfnmsub213ss_fma(auVar79,auVar79,ZEXT416((uint)(fVar263 * 4.0)));
              auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar263 * 4.0)),auVar70,auVar70);
              fVar263 = fVar236 * -fVar236 * 0.5;
              fVar264 = auVar74._0_4_ * 0.5;
              fVar265 = auVar3._0_4_ * 0.5;
              fVar234 = fVar242 * fVar242 * 0.5;
              auVar228._0_4_ = fVar234 * (float)local_9c0._0_4_;
              auVar228._4_4_ = fVar234 * (float)local_9c0._4_4_;
              auVar228._8_4_ = fVar234 * fStack_9b8;
              auVar228._12_4_ = fVar234 * fStack_9b4;
              auVar184._4_4_ = fVar265;
              auVar184._0_4_ = fVar265;
              auVar184._8_4_ = fVar265;
              auVar184._12_4_ = fVar265;
              auVar3 = vfmadd132ps_fma(auVar184,auVar228,local_980._0_16_);
              auVar207._4_4_ = fVar264;
              auVar207._0_4_ = fVar264;
              auVar207._8_4_ = fVar264;
              auVar207._12_4_ = fVar264;
              auVar3 = vfmadd132ps_fma(auVar207,auVar3,local_9a0._0_16_);
              auVar277._4_4_ = fVar263;
              auVar277._0_4_ = fVar263;
              auVar277._8_4_ = fVar263;
              auVar277._12_4_ = fVar263;
              auVar3 = vfmadd132ps_fma(auVar277,auVar3,local_960._0_16_);
              local_860._0_16_ = vdpps_avx(auVar3,auVar3,0x7f);
              auVar45._12_4_ = 0;
              auVar45._0_12_ = ZEXT812(0);
              fVar263 = local_860._0_4_;
              auVar74 = vrsqrt14ss_avx512f(auVar45 << 0x20,ZEXT416((uint)fVar263));
              fVar264 = auVar74._0_4_;
              local_880._0_16_ = vrcp14ss_avx512f(auVar45 << 0x20,ZEXT416((uint)fVar263));
              auVar74 = vfnmadd213ss_fma(local_880._0_16_,local_860._0_16_,ZEXT416(0x40000000));
              local_8a0._0_4_ = auVar74._0_4_;
              uVar62 = auVar83._0_4_;
              if (fVar263 < -fVar263) {
                fVar265 = sqrtf(fVar263);
                auVar83 = ZEXT416(uVar62);
                uVar61 = extraout_RAX_03;
              }
              else {
                auVar74 = vsqrtss_avx(local_860._0_16_,local_860._0_16_);
                fVar265 = auVar74._0_4_;
              }
              auVar73 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar264 * 1.5 +
                                                 fVar263 * -0.5 * fVar264 * fVar264 * fVar264)));
              auVar72 = vmulps_avx512vl(auVar3,auVar73);
              auVar74 = vdpps_avx(auVar2,auVar72,0x7f);
              fVar234 = auVar83._0_4_;
              fVar263 = auVar74._0_4_;
              auVar157._0_4_ = fVar263 * fVar263;
              auVar157._4_4_ = auVar74._4_4_ * auVar74._4_4_;
              auVar157._8_4_ = auVar74._8_4_ * auVar74._8_4_;
              auVar157._12_4_ = auVar74._12_4_ * auVar74._12_4_;
              auVar69 = vsubps_avx(local_a00._0_16_,auVar157);
              fVar264 = auVar69._0_4_;
              auVar185._4_12_ = ZEXT812(0) << 0x20;
              auVar185._0_4_ = fVar264;
              auVar71 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar185);
              auVar75 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
              auVar76 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
              if (fVar264 < 0.0) {
                local_8d0._0_4_ = auVar75._0_4_;
                _local_8f0 = auVar73;
                local_8e0 = auVar72;
                local_8c0 = auVar71;
                fVar264 = sqrtf(fVar264);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar75 = ZEXT416((uint)local_8d0._0_4_);
                auVar83 = ZEXT416(uVar62);
                uVar61 = extraout_RAX_04;
                auVar71 = local_8c0;
                auVar72 = local_8e0;
                auVar73 = _local_8f0;
              }
              else {
                auVar69 = vsqrtss_avx(auVar69,auVar69);
                fVar264 = auVar69._0_4_;
              }
              auVar279 = ZEXT1664(auVar3);
              auVar274 = ZEXT1664(local_a00._0_16_);
              auVar270 = ZEXT1664(auVar2);
              auVar96 = vmovdqa64_avx512vl(auVar85);
              auVar285 = ZEXT3264(auVar96);
              auVar96 = vmovdqa64_avx512vl(auVar86);
              auVar286 = ZEXT3264(auVar96);
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar70,auVar79);
              auVar70 = vfmadd213ss_fma(auVar79,SUB6416(ZEXT464(0xc0000000),0),auVar70);
              auVar267 = local_780._0_16_;
              auVar79 = vshufps_avx(auVar267,auVar267,0x55);
              auVar208._0_4_ = auVar79._0_4_ * (float)local_9c0._0_4_;
              auVar208._4_4_ = auVar79._4_4_ * (float)local_9c0._4_4_;
              auVar208._8_4_ = auVar79._8_4_ * fStack_9b8;
              auVar208._12_4_ = auVar79._12_4_ * fStack_9b4;
              auVar229._0_4_ = auVar70._0_4_;
              auVar229._4_4_ = auVar229._0_4_;
              auVar229._8_4_ = auVar229._0_4_;
              auVar229._12_4_ = auVar229._0_4_;
              auVar79 = vfmadd132ps_fma(auVar229,auVar208,local_980._0_16_);
              auVar186._0_4_ = auVar69._0_4_;
              auVar186._4_4_ = auVar186._0_4_;
              auVar186._8_4_ = auVar186._0_4_;
              auVar186._12_4_ = auVar186._0_4_;
              auVar79 = vfmadd132ps_fma(auVar186,auVar79,local_9a0._0_16_);
              auVar79 = vfmadd132ps_fma(_local_840,auVar79,local_960._0_16_);
              auVar187._0_4_ = auVar79._0_4_ * (float)local_860._0_4_;
              auVar187._4_4_ = auVar79._4_4_ * (float)local_860._0_4_;
              auVar187._8_4_ = auVar79._8_4_ * (float)local_860._0_4_;
              auVar187._12_4_ = auVar79._12_4_ * (float)local_860._0_4_;
              auVar79 = vdpps_avx(auVar3,auVar79,0x7f);
              fVar235 = auVar79._0_4_;
              auVar209._0_4_ = auVar3._0_4_ * fVar235;
              auVar209._4_4_ = auVar3._4_4_ * fVar235;
              auVar209._8_4_ = auVar3._8_4_ * fVar235;
              auVar209._12_4_ = auVar3._12_4_ * fVar235;
              auVar79 = vsubps_avx(auVar187,auVar209);
              fVar235 = (float)local_8a0._0_4_ * (float)local_880._0_4_;
              auVar70 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                   ZEXT416((uint)(local_780._0_4_ * fVar258 * 1.9073486e-06)));
              auVar210._0_4_ = auVar79._0_4_ * fVar235;
              auVar210._4_4_ = auVar79._4_4_ * fVar235;
              auVar210._8_4_ = auVar79._8_4_ * fVar235;
              auVar210._12_4_ = auVar79._12_4_ * fVar235;
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(auVar3,auVar26);
              auVar73 = vmulps_avx512vl(auVar73,auVar210);
              auVar79 = vdpps_avx(auVar77,auVar72,0x7f);
              auVar69 = vfmadd213ss_fma(auVar83,ZEXT416((uint)local_940._0_4_),auVar70);
              auVar83 = vdpps_avx(auVar2,auVar73,0x7f);
              auVar73 = vfmadd213ss_fma(ZEXT416((uint)(fVar234 + 1.0)),
                                        ZEXT416((uint)((float)local_940._0_4_ / fVar265)),auVar69);
              fVar265 = auVar79._0_4_ + auVar83._0_4_;
              auVar83 = vdpps_avx(local_9d0,auVar72,0x7f);
              auVar79 = vdpps_avx(auVar2,auVar77,0x7f);
              auVar69 = vmulss_avx512f(auVar76,auVar71);
              auVar75 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar69._0_4_ *
                                                             auVar71._0_4_ * auVar71._0_4_)));
              auVar69 = vdpps_avx(auVar2,local_9d0,0x7f);
              auVar72 = vfnmadd231ss_fma(auVar79,auVar74,ZEXT416((uint)fVar265));
              auVar69 = vfnmadd231ss_fma(auVar69,auVar74,auVar83);
              auVar79 = vpermilps_avx(local_820._0_16_,0xff);
              fVar264 = fVar264 - auVar79._0_4_;
              auVar71 = vshufps_avx(auVar3,auVar3,0xff);
              auVar79 = vfmsub213ss_fma(auVar72,auVar75,auVar71);
              auVar260._8_4_ = 0x80000000;
              auVar260._0_8_ = 0x8000000080000000;
              auVar260._12_4_ = 0x80000000;
              auVar262 = ZEXT1664(auVar260);
              auVar255._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
              auVar255._8_4_ = auVar79._8_4_ ^ 0x80000000;
              auVar255._12_4_ = auVar79._12_4_ ^ 0x80000000;
              auVar257 = ZEXT1664(auVar255);
              auVar69 = ZEXT416((uint)(auVar69._0_4_ * auVar75._0_4_));
              auVar72 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar79._0_4_)),
                                        ZEXT416((uint)fVar265),auVar69);
              auVar79 = vinsertps_avx(auVar255,auVar69,0x1c);
              auVar246._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
              auVar246._8_4_ = auVar83._8_4_ ^ 0x80000000;
              auVar246._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar69 = vinsertps_avx(ZEXT416((uint)fVar265),auVar246,0x10);
              auVar230._0_4_ = auVar72._0_4_;
              auVar230._4_4_ = auVar230._0_4_;
              auVar230._8_4_ = auVar230._0_4_;
              auVar230._12_4_ = auVar230._0_4_;
              auVar83 = vdivps_avx(auVar79,auVar230);
              auVar79 = vdivps_avx(auVar69,auVar230);
              auVar231._0_4_ = fVar263 * auVar83._0_4_ + fVar264 * auVar79._0_4_;
              auVar231._4_4_ = fVar263 * auVar83._4_4_ + fVar264 * auVar79._4_4_;
              auVar231._8_4_ = fVar263 * auVar83._8_4_ + fVar264 * auVar79._8_4_;
              auVar231._12_4_ = fVar263 * auVar83._12_4_ + fVar264 * auVar79._12_4_;
              auVar83 = vsubps_avx(auVar267,auVar231);
              auVar268 = ZEXT1664(auVar83);
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(auVar74,auVar27);
              if (auVar79._0_4_ < auVar73._0_4_) {
                auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ + auVar70._0_4_)),local_900,
                                          ZEXT416(0x36000000));
                auVar28._8_4_ = 0x7fffffff;
                auVar28._0_8_ = 0x7fffffff7fffffff;
                auVar28._12_4_ = 0x7fffffff;
                auVar74 = vandps_avx512vl(ZEXT416((uint)fVar264),auVar28);
                if (auVar74._0_4_ < auVar79._0_4_) {
                  bVar60 = uVar57 < 5;
                  fVar258 = auVar83._0_4_ + (float)local_910._0_4_;
                  if ((fVar17 <= fVar258) &&
                     (fVar263 = *(float *)(ray + k * 4 + 0x200), fVar258 <= fVar263)) {
                    auVar79 = vmovshdup_avx(auVar83);
                    bVar56 = 0;
                    if ((auVar79._0_4_ < 0.0) || (1.0 < auVar79._0_4_)) goto LAB_018e0208;
                    auVar232._0_12_ = ZEXT812(0);
                    auVar232._12_4_ = 0;
                    auVar211._4_8_ = auVar232._4_8_;
                    auVar211._0_4_ = local_a00._0_4_;
                    auVar211._12_4_ = 0;
                    auVar79 = vrsqrt14ss_avx512f(auVar232,auVar211);
                    fVar264 = auVar79._0_4_;
                    pGVar5 = (context->scene->geometries).items[uVar4].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar56 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_018e0208;
                      fVar264 = fVar264 * 1.5 + local_a00._0_4_ * -0.5 * fVar264 * fVar264 * fVar264
                      ;
                      auVar212._0_4_ = auVar2._0_4_ * fVar264;
                      auVar212._4_4_ = auVar2._4_4_ * fVar264;
                      auVar212._8_4_ = auVar2._8_4_ * fVar264;
                      auVar212._12_4_ = auVar2._12_4_ * fVar264;
                      auVar70 = vfmadd213ps_fma(auVar71,auVar212,auVar3);
                      auVar79 = vshufps_avx(auVar212,auVar212,0xc9);
                      auVar74 = vshufps_avx(auVar3,auVar3,0xc9);
                      auVar213._0_4_ = auVar212._0_4_ * auVar74._0_4_;
                      auVar213._4_4_ = auVar212._4_4_ * auVar74._4_4_;
                      auVar213._8_4_ = auVar212._8_4_ * auVar74._8_4_;
                      auVar213._12_4_ = auVar212._12_4_ * auVar74._12_4_;
                      auVar69 = vfmsub231ps_fma(auVar213,auVar3,auVar79);
                      auVar79 = vshufps_avx(auVar69,auVar69,0xc9);
                      auVar74 = vshufps_avx(auVar70,auVar70,0xc9);
                      auVar69 = vshufps_avx(auVar69,auVar69,0xd2);
                      auVar158._0_4_ = auVar70._0_4_ * auVar69._0_4_;
                      auVar158._4_4_ = auVar70._4_4_ * auVar69._4_4_;
                      auVar158._8_4_ = auVar70._8_4_ * auVar69._8_4_;
                      auVar158._12_4_ = auVar70._12_4_ * auVar69._12_4_;
                      auVar79 = vfmsub231ps_fma(auVar158,auVar79,auVar74);
                      auVar167 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar167,auVar268);
                      auVar167 = vpermps_avx512f(auVar167,ZEXT1664(auVar79));
                      auVar139 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar139,ZEXT1664(auVar79));
                      local_380 = vbroadcastss_avx512f(auVar79);
                      local_400[0] = (RTCHitN)auVar167[0];
                      local_400[1] = (RTCHitN)auVar167[1];
                      local_400[2] = (RTCHitN)auVar167[2];
                      local_400[3] = (RTCHitN)auVar167[3];
                      local_400[4] = (RTCHitN)auVar167[4];
                      local_400[5] = (RTCHitN)auVar167[5];
                      local_400[6] = (RTCHitN)auVar167[6];
                      local_400[7] = (RTCHitN)auVar167[7];
                      local_400[8] = (RTCHitN)auVar167[8];
                      local_400[9] = (RTCHitN)auVar167[9];
                      local_400[10] = (RTCHitN)auVar167[10];
                      local_400[0xb] = (RTCHitN)auVar167[0xb];
                      local_400[0xc] = (RTCHitN)auVar167[0xc];
                      local_400[0xd] = (RTCHitN)auVar167[0xd];
                      local_400[0xe] = (RTCHitN)auVar167[0xe];
                      local_400[0xf] = (RTCHitN)auVar167[0xf];
                      local_400[0x10] = (RTCHitN)auVar167[0x10];
                      local_400[0x11] = (RTCHitN)auVar167[0x11];
                      local_400[0x12] = (RTCHitN)auVar167[0x12];
                      local_400[0x13] = (RTCHitN)auVar167[0x13];
                      local_400[0x14] = (RTCHitN)auVar167[0x14];
                      local_400[0x15] = (RTCHitN)auVar167[0x15];
                      local_400[0x16] = (RTCHitN)auVar167[0x16];
                      local_400[0x17] = (RTCHitN)auVar167[0x17];
                      local_400[0x18] = (RTCHitN)auVar167[0x18];
                      local_400[0x19] = (RTCHitN)auVar167[0x19];
                      local_400[0x1a] = (RTCHitN)auVar167[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar167[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar167[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar167[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar167[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar167[0x1f];
                      local_400[0x20] = (RTCHitN)auVar167[0x20];
                      local_400[0x21] = (RTCHitN)auVar167[0x21];
                      local_400[0x22] = (RTCHitN)auVar167[0x22];
                      local_400[0x23] = (RTCHitN)auVar167[0x23];
                      local_400[0x24] = (RTCHitN)auVar167[0x24];
                      local_400[0x25] = (RTCHitN)auVar167[0x25];
                      local_400[0x26] = (RTCHitN)auVar167[0x26];
                      local_400[0x27] = (RTCHitN)auVar167[0x27];
                      local_400[0x28] = (RTCHitN)auVar167[0x28];
                      local_400[0x29] = (RTCHitN)auVar167[0x29];
                      local_400[0x2a] = (RTCHitN)auVar167[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar167[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar167[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar167[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar167[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar167[0x2f];
                      local_400[0x30] = (RTCHitN)auVar167[0x30];
                      local_400[0x31] = (RTCHitN)auVar167[0x31];
                      local_400[0x32] = (RTCHitN)auVar167[0x32];
                      local_400[0x33] = (RTCHitN)auVar167[0x33];
                      local_400[0x34] = (RTCHitN)auVar167[0x34];
                      local_400[0x35] = (RTCHitN)auVar167[0x35];
                      local_400[0x36] = (RTCHitN)auVar167[0x36];
                      local_400[0x37] = (RTCHitN)auVar167[0x37];
                      local_400[0x38] = (RTCHitN)auVar167[0x38];
                      local_400[0x39] = (RTCHitN)auVar167[0x39];
                      local_400[0x3a] = (RTCHitN)auVar167[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar167[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar167[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar167[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar167[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar167[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar167 = vmovdqa64_avx512f(local_4c0);
                      local_280 = vmovdqa64_avx512f(auVar167);
                      vpcmpeqd_avx2(auVar167._0_32_,auVar167._0_32_);
                      local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar258;
                      auVar167 = vmovdqa64_avx512f(local_500);
                      local_740 = vmovdqa64_avx512f(auVar167);
                      local_a30.valid = (int *)local_740;
                      local_a30.geometryUserPtr = pGVar5->userPtr;
                      local_a30.context = context->user;
                      local_a30.hit = local_400;
                      local_a30.N = 0x10;
                      local_a30.ray = (RTCRayN *)ray;
                      if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar257 = ZEXT1664(auVar255);
                        auVar262 = ZEXT1664(auVar260);
                        auVar268 = ZEXT1664(auVar83);
                        auVar270 = ZEXT1664(auVar2);
                        auVar274 = ZEXT1664(local_a00._0_16_);
                        auVar279 = ZEXT1664(auVar3);
                        (*pGVar5->occlusionFilterN)(&local_a30);
                        auVar96 = vmovdqa64_avx512vl(auVar86);
                        auVar286 = ZEXT3264(auVar96);
                        auVar96 = vmovdqa64_avx512vl(auVar85);
                        auVar285 = ZEXT3264(auVar96);
                        auVar167 = vmovdqa64_avx512f(local_740);
                      }
                      uVar19 = vptestmd_avx512f(auVar167,auVar167);
                      if ((short)uVar19 != 0) {
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar257 = ZEXT1664(auVar257._0_16_);
                          auVar262 = ZEXT1664(auVar262._0_16_);
                          auVar268 = ZEXT1664(auVar268._0_16_);
                          auVar270 = ZEXT1664(auVar270._0_16_);
                          auVar274 = ZEXT1664(auVar274._0_16_);
                          auVar279 = ZEXT1664(auVar279._0_16_);
                          (*p_Var9)(&local_a30);
                          auVar96 = vmovdqa64_avx512vl(auVar86);
                          auVar286 = ZEXT3264(auVar96);
                          auVar96 = vmovdqa64_avx512vl(auVar85);
                          auVar285 = ZEXT3264(auVar96);
                          auVar167 = vmovdqa64_avx512f(local_740);
                        }
                        uVar61 = vptestmd_avx512f(auVar167,auVar167);
                        auVar167 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar10 = (bool)((byte)uVar61 & 1);
                        auVar141._0_4_ =
                             (uint)bVar10 * auVar167._0_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x200);
                        bVar10 = (bool)((byte)(uVar61 >> 1) & 1);
                        auVar141._4_4_ =
                             (uint)bVar10 * auVar167._4_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x204);
                        bVar10 = (bool)((byte)(uVar61 >> 2) & 1);
                        auVar141._8_4_ =
                             (uint)bVar10 * auVar167._8_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x208);
                        bVar10 = (bool)((byte)(uVar61 >> 3) & 1);
                        auVar141._12_4_ =
                             (uint)bVar10 * auVar167._12_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x20c);
                        bVar10 = (bool)((byte)(uVar61 >> 4) & 1);
                        auVar141._16_4_ =
                             (uint)bVar10 * auVar167._16_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x210);
                        bVar10 = (bool)((byte)(uVar61 >> 5) & 1);
                        auVar141._20_4_ =
                             (uint)bVar10 * auVar167._20_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x214);
                        bVar10 = (bool)((byte)(uVar61 >> 6) & 1);
                        auVar141._24_4_ =
                             (uint)bVar10 * auVar167._24_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x218);
                        bVar10 = (bool)((byte)(uVar61 >> 7) & 1);
                        auVar141._28_4_ =
                             (uint)bVar10 * auVar167._28_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x21c);
                        bVar10 = (bool)((byte)(uVar61 >> 8) & 1);
                        auVar141._32_4_ =
                             (uint)bVar10 * auVar167._32_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x220);
                        bVar10 = (bool)((byte)(uVar61 >> 9) & 1);
                        auVar141._36_4_ =
                             (uint)bVar10 * auVar167._36_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x224);
                        bVar10 = (bool)((byte)(uVar61 >> 10) & 1);
                        auVar141._40_4_ =
                             (uint)bVar10 * auVar167._40_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x228);
                        bVar10 = (bool)((byte)(uVar61 >> 0xb) & 1);
                        auVar141._44_4_ =
                             (uint)bVar10 * auVar167._44_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x22c);
                        bVar10 = (bool)((byte)(uVar61 >> 0xc) & 1);
                        auVar141._48_4_ =
                             (uint)bVar10 * auVar167._48_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x230);
                        bVar10 = (bool)((byte)(uVar61 >> 0xd) & 1);
                        auVar141._52_4_ =
                             (uint)bVar10 * auVar167._52_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x234);
                        bVar10 = (bool)((byte)(uVar61 >> 0xe) & 1);
                        auVar141._56_4_ =
                             (uint)bVar10 * auVar167._56_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x238);
                        bVar10 = SUB81(uVar61 >> 0xf,0);
                        auVar141._60_4_ =
                             (uint)bVar10 * auVar167._60_4_ |
                             (uint)!bVar10 * *(int *)(local_a30.ray + 0x23c);
                        *(undefined1 (*) [64])(local_a30.ray + 0x200) = auVar141;
                        bVar56 = 1;
                        if ((short)uVar61 != 0) goto LAB_018e0208;
                      }
                      *(float *)(ray + k * 4 + 0x200) = fVar263;
                    }
                  }
                  bVar56 = 0;
                  goto LAB_018e0208;
                }
              }
              uVar57 = uVar57 + 1;
            }
            bVar60 = false;
LAB_018e0208:
            bVar52 = bVar52 | bVar60 & bVar56;
            uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar248._4_4_ = uVar174;
            auVar248._0_4_ = uVar174;
            auVar248._8_4_ = uVar174;
            auVar248._12_4_ = uVar174;
            auVar248._16_4_ = uVar174;
            auVar248._20_4_ = uVar174;
            auVar248._24_4_ = uVar174;
            auVar248._28_4_ = uVar174;
            auVar167 = ZEXT3264(auVar248);
            auVar47._4_4_ = fStack_6dc;
            auVar47._0_4_ = local_6e0;
            auVar47._8_4_ = fStack_6d8;
            auVar47._12_4_ = fStack_6d4;
            auVar47._16_4_ = fStack_6d0;
            auVar47._20_4_ = fStack_6cc;
            auVar47._24_4_ = fStack_6c8;
            auVar47._28_4_ = fStack_6c4;
            uVar19 = vcmpps_avx512vl(auVar248,auVar47,0xd);
          }
          uVar21 = vpcmpd_avx512vl(local_6a0,local_640,1);
          uVar20 = vpcmpd_avx512vl(local_6a0,_local_700,1);
          auVar190._0_4_ = (float)local_7a0._0_4_ + (float)local_440._0_4_;
          auVar190._4_4_ = (float)local_7a0._4_4_ + (float)local_440._4_4_;
          auVar190._8_4_ = fStack_798 + fStack_438;
          auVar190._12_4_ = fStack_794 + fStack_434;
          auVar190._16_4_ = fStack_790 + fStack_430;
          auVar190._20_4_ = fStack_78c + fStack_42c;
          auVar190._24_4_ = fStack_788 + fStack_428;
          auVar190._28_4_ = fStack_784 + fStack_424;
          uVar174 = auVar167._0_4_;
          auVar215._4_4_ = uVar174;
          auVar215._0_4_ = uVar174;
          auVar215._8_4_ = uVar174;
          auVar215._12_4_ = uVar174;
          auVar215._16_4_ = uVar174;
          auVar215._20_4_ = uVar174;
          auVar215._24_4_ = uVar174;
          auVar215._28_4_ = uVar174;
          uVar19 = vcmpps_avx512vl(auVar190,auVar215,2);
          bVar53 = bVar53 & (byte)uVar21 & (byte)uVar19;
          auVar233._0_4_ = (float)local_7a0._0_4_ + local_680._0_4_;
          auVar233._4_4_ = (float)local_7a0._4_4_ + local_680._4_4_;
          auVar233._8_4_ = fStack_798 + local_680._8_4_;
          auVar233._12_4_ = fStack_794 + local_680._12_4_;
          auVar233._16_4_ = fStack_790 + local_680._16_4_;
          auVar233._20_4_ = fStack_78c + local_680._20_4_;
          auVar233._24_4_ = fStack_788 + local_680._24_4_;
          auVar233._28_4_ = fStack_784 + local_680._28_4_;
          uVar19 = vcmpps_avx512vl(auVar233,auVar215,2);
          bVar49 = bVar49 & (byte)uVar20 & (byte)uVar19 | bVar53;
          if (bVar49 != 0) {
            abStack_1a0[uVar55 * 0x60] = bVar49;
            auVar137._0_4_ =
                 (uint)(bVar53 & 1) * local_440._0_4_ |
                 (uint)!(bool)(bVar53 & 1) * (int)local_680._0_4_;
            bVar60 = (bool)(bVar53 >> 1 & 1);
            auVar137._4_4_ = (uint)bVar60 * local_440._4_4_ | (uint)!bVar60 * (int)local_680._4_4_;
            bVar60 = (bool)(bVar53 >> 2 & 1);
            auVar137._8_4_ = (uint)bVar60 * (int)fStack_438 | (uint)!bVar60 * (int)local_680._8_4_;
            bVar60 = (bool)(bVar53 >> 3 & 1);
            auVar137._12_4_ = (uint)bVar60 * (int)fStack_434 | (uint)!bVar60 * (int)local_680._12_4_
            ;
            bVar60 = (bool)(bVar53 >> 4 & 1);
            auVar137._16_4_ = (uint)bVar60 * (int)fStack_430 | (uint)!bVar60 * (int)local_680._16_4_
            ;
            bVar60 = (bool)(bVar53 >> 5 & 1);
            auVar137._20_4_ = (uint)bVar60 * (int)fStack_42c | (uint)!bVar60 * (int)local_680._20_4_
            ;
            auVar137._24_4_ =
                 (uint)(bVar53 >> 6) * (int)fStack_428 |
                 (uint)!(bool)(bVar53 >> 6) * (int)local_680._24_4_;
            auVar137._28_4_ = local_680._28_4_;
            *(undefined1 (*) [32])(auStack_180 + uVar55 * 0x60) = auVar137;
            uVar61 = vmovlps_avx(local_6b0);
            (&uStack_160)[uVar55 * 0xc] = uVar61;
            aiStack_158[uVar55 * 0x18] = local_cfc + 1;
            uVar55 = (ulong)((int)uVar55 + 1);
          }
          auVar167 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
        }
      }
    }
    do {
      uVar62 = (uint)uVar55;
      uVar55 = (ulong)(uVar62 - 1);
      if (uVar62 == 0) {
        if (bVar52 != 0) goto LAB_018e080d;
        uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar29._4_4_ = uVar174;
        auVar29._0_4_ = uVar174;
        auVar29._8_4_ = uVar174;
        auVar29._12_4_ = uVar174;
        uVar19 = vcmpps_avx512vl(local_6c0,auVar29,2);
        local_8a8 = (ulong)((uint)uVar19 & (uint)local_8a8 - 1 & (uint)local_8a8);
        goto LAB_018ddd46;
      }
      lVar54 = uVar55 * 0x60;
      auVar99 = *(undefined1 (*) [32])(auStack_180 + lVar54);
      auVar191._0_4_ = auVar99._0_4_ + (float)local_7a0._0_4_;
      auVar191._4_4_ = auVar99._4_4_ + (float)local_7a0._4_4_;
      auVar191._8_4_ = auVar99._8_4_ + fStack_798;
      auVar191._12_4_ = auVar99._12_4_ + fStack_794;
      auVar191._16_4_ = auVar99._16_4_ + fStack_790;
      auVar191._20_4_ = auVar99._20_4_ + fStack_78c;
      auVar191._24_4_ = auVar99._24_4_ + fStack_788;
      auVar191._28_4_ = auVar99._28_4_ + fStack_784;
      uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar33._4_4_ = uVar174;
      auVar33._0_4_ = uVar174;
      auVar33._8_4_ = uVar174;
      auVar33._12_4_ = uVar174;
      auVar33._16_4_ = uVar174;
      auVar33._20_4_ = uVar174;
      auVar33._24_4_ = uVar174;
      auVar33._28_4_ = uVar174;
      uVar19 = vcmpps_avx512vl(auVar191,auVar33,2);
      uVar142 = (uint)uVar19 & (uint)abStack_1a0[lVar54];
    } while (uVar142 == 0);
    uVar61 = (&uStack_160)[uVar55 * 0xc];
    auVar188._8_8_ = 0;
    auVar188._0_8_ = uVar61;
    auVar216._8_4_ = 0x7f800000;
    auVar216._0_8_ = 0x7f8000007f800000;
    auVar216._12_4_ = 0x7f800000;
    auVar216._16_4_ = 0x7f800000;
    auVar216._20_4_ = 0x7f800000;
    auVar216._24_4_ = 0x7f800000;
    auVar216._28_4_ = 0x7f800000;
    auVar96 = vblendmps_avx512vl(auVar216,auVar99);
    bVar49 = (byte)uVar142;
    auVar138._0_4_ =
         (uint)(bVar49 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar49 & 1) * (int)auVar99._0_4_;
    bVar60 = (bool)((byte)(uVar142 >> 1) & 1);
    auVar138._4_4_ = (uint)bVar60 * auVar96._4_4_ | (uint)!bVar60 * (int)auVar99._4_4_;
    bVar60 = (bool)((byte)(uVar142 >> 2) & 1);
    auVar138._8_4_ = (uint)bVar60 * auVar96._8_4_ | (uint)!bVar60 * (int)auVar99._8_4_;
    bVar60 = (bool)((byte)(uVar142 >> 3) & 1);
    auVar138._12_4_ = (uint)bVar60 * auVar96._12_4_ | (uint)!bVar60 * (int)auVar99._12_4_;
    bVar60 = (bool)((byte)(uVar142 >> 4) & 1);
    auVar138._16_4_ = (uint)bVar60 * auVar96._16_4_ | (uint)!bVar60 * (int)auVar99._16_4_;
    bVar60 = (bool)((byte)(uVar142 >> 5) & 1);
    auVar138._20_4_ = (uint)bVar60 * auVar96._20_4_ | (uint)!bVar60 * (int)auVar99._20_4_;
    bVar60 = (bool)((byte)(uVar142 >> 6) & 1);
    auVar138._24_4_ = (uint)bVar60 * auVar96._24_4_ | (uint)!bVar60 * (int)auVar99._24_4_;
    auVar138._28_4_ =
         (uVar142 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar142 >> 7,0) * (int)auVar99._28_4_;
    auVar99 = vshufps_avx(auVar138,auVar138,0xb1);
    auVar99 = vminps_avx(auVar138,auVar99);
    auVar96 = vshufpd_avx(auVar99,auVar99,5);
    auVar99 = vminps_avx(auVar99,auVar96);
    auVar96 = vpermpd_avx2(auVar99,0x4e);
    auVar99 = vminps_avx(auVar99,auVar96);
    uVar19 = vcmpps_avx512vl(auVar138,auVar99,0);
    bVar58 = (byte)uVar19 & bVar49;
    if (bVar58 != 0) {
      uVar142 = (uint)bVar58;
    }
    uVar143 = 0;
    for (; (uVar142 & 1) == 0; uVar142 = uVar142 >> 1 | 0x80000000) {
      uVar143 = uVar143 + 1;
    }
    local_cfc = aiStack_158[uVar55 * 0x18];
    bVar49 = ~('\x01' << ((byte)uVar143 & 0x1f)) & bVar49;
    abStack_1a0[lVar54] = bVar49;
    if (bVar49 == 0) {
      uVar62 = uVar62 - 1;
    }
    uVar174 = (undefined4)uVar61;
    auVar166._4_4_ = uVar174;
    auVar166._0_4_ = uVar174;
    auVar166._8_4_ = uVar174;
    auVar166._12_4_ = uVar174;
    auVar166._16_4_ = uVar174;
    auVar166._20_4_ = uVar174;
    auVar166._24_4_ = uVar174;
    auVar166._28_4_ = uVar174;
    auVar83 = vmovshdup_avx(auVar188);
    auVar83 = vsubps_avx(auVar83,auVar188);
    auVar192._0_4_ = auVar83._0_4_;
    auVar192._4_4_ = auVar192._0_4_;
    auVar192._8_4_ = auVar192._0_4_;
    auVar192._12_4_ = auVar192._0_4_;
    auVar192._16_4_ = auVar192._0_4_;
    auVar192._20_4_ = auVar192._0_4_;
    auVar192._24_4_ = auVar192._0_4_;
    auVar192._28_4_ = auVar192._0_4_;
    auVar83 = vfmadd132ps_fma(auVar192,auVar166,_DAT_01f7b040);
    auVar99 = ZEXT1632(auVar83);
    local_400[0] = (RTCHitN)auVar99[0];
    local_400[1] = (RTCHitN)auVar99[1];
    local_400[2] = (RTCHitN)auVar99[2];
    local_400[3] = (RTCHitN)auVar99[3];
    local_400[4] = (RTCHitN)auVar99[4];
    local_400[5] = (RTCHitN)auVar99[5];
    local_400[6] = (RTCHitN)auVar99[6];
    local_400[7] = (RTCHitN)auVar99[7];
    local_400[8] = (RTCHitN)auVar99[8];
    local_400[9] = (RTCHitN)auVar99[9];
    local_400[10] = (RTCHitN)auVar99[10];
    local_400[0xb] = (RTCHitN)auVar99[0xb];
    local_400[0xc] = (RTCHitN)auVar99[0xc];
    local_400[0xd] = (RTCHitN)auVar99[0xd];
    local_400[0xe] = (RTCHitN)auVar99[0xe];
    local_400[0xf] = (RTCHitN)auVar99[0xf];
    local_400[0x10] = (RTCHitN)auVar99[0x10];
    local_400[0x11] = (RTCHitN)auVar99[0x11];
    local_400[0x12] = (RTCHitN)auVar99[0x12];
    local_400[0x13] = (RTCHitN)auVar99[0x13];
    local_400[0x14] = (RTCHitN)auVar99[0x14];
    local_400[0x15] = (RTCHitN)auVar99[0x15];
    local_400[0x16] = (RTCHitN)auVar99[0x16];
    local_400[0x17] = (RTCHitN)auVar99[0x17];
    local_400[0x18] = (RTCHitN)auVar99[0x18];
    local_400[0x19] = (RTCHitN)auVar99[0x19];
    local_400[0x1a] = (RTCHitN)auVar99[0x1a];
    local_400[0x1b] = (RTCHitN)auVar99[0x1b];
    local_400[0x1c] = (RTCHitN)auVar99[0x1c];
    local_400[0x1d] = (RTCHitN)auVar99[0x1d];
    local_400[0x1e] = (RTCHitN)auVar99[0x1e];
    local_400[0x1f] = (RTCHitN)auVar99[0x1f];
    local_6b0._8_8_ = 0;
    local_6b0._0_8_ = *(ulong *)(local_400 + (ulong)uVar143 * 4);
    uVar55 = (ulong)uVar62;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }